

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx2::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  uint uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  Primitive PVar8;
  Geometry *pGVar9;
  code *pcVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  ulong uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [12];
  undefined1 auVar67 [32];
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [28];
  undefined1 auVar77 [32];
  undefined1 auVar78 [24];
  int iVar79;
  undefined4 uVar80;
  ulong uVar81;
  Geometry *pGVar82;
  RTCIntersectArguments *pRVar83;
  ulong uVar84;
  uint uVar85;
  ulong uVar86;
  ulong uVar87;
  long lVar88;
  long lVar89;
  undefined8 uVar90;
  float fVar107;
  vint4 bi_2;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar106;
  float fVar108;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar95 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar123;
  vint4 bi_1;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar124;
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  float fVar140;
  float fVar145;
  vint4 ai_2;
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  vint4 ai;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  vint4 bi;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  vint4 ai_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar177;
  float fVar186;
  float fVar187;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar181 [32];
  float fVar188;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  undefined1 auVar192 [16];
  undefined1 auVar198 [64];
  undefined4 uVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [64];
  float fVar202;
  undefined1 auVar203 [16];
  undefined8 uVar206;
  undefined8 uVar207;
  undefined8 uVar208;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  RTCFilterFunctionNArguments args;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  long local_610;
  ulong local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  undefined8 uStack_558;
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  int local_320;
  int local_31c;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  float local_2a0 [4];
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar8 = prim[1];
  uVar81 = (ulong)(byte)PVar8;
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar125 = *(float *)(prim + uVar81 * 0x19 + 0x12);
  auVar12 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + uVar81 * 0x19 + 6));
  auVar91._0_4_ = fVar125 * auVar12._0_4_;
  auVar91._4_4_ = fVar125 * auVar12._4_4_;
  auVar91._8_4_ = fVar125 * auVar12._8_4_;
  auVar91._12_4_ = fVar125 * auVar12._12_4_;
  auVar153._0_4_ = fVar125 * auVar13._0_4_;
  auVar153._4_4_ = fVar125 * auVar13._4_4_;
  auVar153._8_4_ = fVar125 * auVar13._8_4_;
  auVar153._12_4_ = fVar125 * auVar13._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xc + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xd + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x12 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x13 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar201 = ZEXT1664(auVar93);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x14 + 6)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar211._4_4_ = auVar153._0_4_;
  auVar211._0_4_ = auVar153._0_4_;
  auVar211._8_4_ = auVar153._0_4_;
  auVar211._12_4_ = auVar153._0_4_;
  auVar113 = vshufps_avx(auVar153,auVar153,0x55);
  auVar92 = vshufps_avx(auVar153,auVar153,0xaa);
  fVar125 = auVar92._0_4_;
  auVar192._0_4_ = fVar125 * auVar14._0_4_;
  fVar124 = auVar92._4_4_;
  auVar192._4_4_ = fVar124 * auVar14._4_4_;
  fVar106 = auVar92._8_4_;
  auVar192._8_4_ = fVar106 * auVar14._8_4_;
  fVar107 = auVar92._12_4_;
  auVar192._12_4_ = fVar107 * auVar14._12_4_;
  auVar178._0_4_ = auVar17._0_4_ * fVar125;
  auVar178._4_4_ = auVar17._4_4_ * fVar124;
  auVar178._8_4_ = auVar17._8_4_ * fVar106;
  auVar178._12_4_ = auVar17._12_4_ * fVar107;
  auVar168._0_4_ = auVar126._0_4_ * fVar125;
  auVar168._4_4_ = auVar126._4_4_ * fVar124;
  auVar168._8_4_ = auVar126._8_4_ * fVar106;
  auVar168._12_4_ = auVar126._12_4_ * fVar107;
  auVar92 = vfmadd231ps_fma(auVar192,auVar113,auVar13);
  auVar114 = vfmadd231ps_fma(auVar178,auVar113,auVar16);
  auVar113 = vfmadd231ps_fma(auVar168,auVar93,auVar113);
  auVar141 = vfmadd231ps_fma(auVar92,auVar211,auVar12);
  auVar198 = ZEXT1664(auVar141);
  auVar114 = vfmadd231ps_fma(auVar114,auVar211,auVar15);
  auVar147 = vfmadd231ps_fma(auVar113,auVar94,auVar211);
  auVar212._4_4_ = auVar91._0_4_;
  auVar212._0_4_ = auVar91._0_4_;
  auVar212._8_4_ = auVar91._0_4_;
  auVar212._12_4_ = auVar91._0_4_;
  auVar113 = vshufps_avx(auVar91,auVar91,0x55);
  auVar92 = vshufps_avx(auVar91,auVar91,0xaa);
  fVar125 = auVar92._0_4_;
  auVar154._0_4_ = fVar125 * auVar14._0_4_;
  fVar124 = auVar92._4_4_;
  auVar154._4_4_ = fVar124 * auVar14._4_4_;
  fVar106 = auVar92._8_4_;
  auVar154._8_4_ = fVar106 * auVar14._8_4_;
  fVar107 = auVar92._12_4_;
  auVar154._12_4_ = fVar107 * auVar14._12_4_;
  auVar112._0_4_ = auVar17._0_4_ * fVar125;
  auVar112._4_4_ = auVar17._4_4_ * fVar124;
  auVar112._8_4_ = auVar17._8_4_ * fVar106;
  auVar112._12_4_ = auVar17._12_4_ * fVar107;
  auVar92._0_4_ = auVar126._0_4_ * fVar125;
  auVar92._4_4_ = auVar126._4_4_ * fVar124;
  auVar92._8_4_ = auVar126._8_4_ * fVar106;
  auVar92._12_4_ = auVar126._12_4_ * fVar107;
  auVar13 = vfmadd231ps_fma(auVar154,auVar113,auVar13);
  auVar14 = vfmadd231ps_fma(auVar112,auVar113,auVar16);
  auVar16 = vfmadd231ps_fma(auVar92,auVar113,auVar93);
  auVar17 = vfmadd231ps_fma(auVar13,auVar212,auVar12);
  auVar93 = vfmadd231ps_fma(auVar14,auVar212,auVar15);
  auVar126 = vfmadd231ps_fma(auVar16,auVar212,auVar94);
  local_410._8_4_ = 0x7fffffff;
  local_410._0_8_ = 0x7fffffff7fffffff;
  local_410._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar141,local_410);
  auVar146._8_4_ = 0x219392ef;
  auVar146._0_8_ = 0x219392ef219392ef;
  auVar146._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar146,1);
  auVar13 = vblendvps_avx(auVar141,auVar146,auVar12);
  auVar12 = vandps_avx(auVar114,local_410);
  auVar12 = vcmpps_avx(auVar12,auVar146,1);
  auVar14 = vblendvps_avx(auVar114,auVar146,auVar12);
  auVar12 = vandps_avx(local_410,auVar147);
  auVar12 = vcmpps_avx(auVar12,auVar146,1);
  auVar12 = vblendvps_avx(auVar147,auVar146,auVar12);
  auVar15 = vrcpps_avx(auVar13);
  auVar169._8_4_ = 0x3f800000;
  auVar169._0_8_ = 0x3f8000003f800000;
  auVar169._12_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar13,auVar15,auVar169);
  auVar15 = vfmadd132ps_fma(auVar13,auVar15,auVar15);
  auVar13 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar13,auVar169);
  auVar16 = vfmadd132ps_fma(auVar14,auVar13,auVar13);
  auVar13 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar13,auVar169);
  auVar94 = vfmadd132ps_fma(auVar12,auVar13,auVar13);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar17);
  auVar147._0_4_ = auVar15._0_4_ * auVar12._0_4_;
  auVar147._4_4_ = auVar15._4_4_ * auVar12._4_4_;
  auVar147._8_4_ = auVar15._8_4_ * auVar12._8_4_;
  auVar147._12_4_ = auVar15._12_4_ * auVar12._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar81 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar17);
  auVar155._0_4_ = auVar15._0_4_ * auVar12._0_4_;
  auVar155._4_4_ = auVar15._4_4_ * auVar12._4_4_;
  auVar155._8_4_ = auVar15._8_4_ * auVar12._8_4_;
  auVar155._12_4_ = auVar15._12_4_ * auVar12._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar81 * 0xe + 6);
  auVar12 = vpmovsxwd_avx(auVar14);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar93);
  auVar163._0_4_ = auVar16._0_4_ * auVar12._0_4_;
  auVar163._4_4_ = auVar16._4_4_ * auVar12._4_4_;
  auVar163._8_4_ = auVar16._8_4_ * auVar12._8_4_;
  auVar163._12_4_ = auVar16._12_4_ * auVar12._12_4_;
  auVar114._1_3_ = 0;
  auVar114[0] = PVar8;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar12 = vpmovsxwd_avx(auVar15);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar93);
  auVar113._0_4_ = auVar16._0_4_ * auVar12._0_4_;
  auVar113._4_4_ = auVar16._4_4_ * auVar12._4_4_;
  auVar113._8_4_ = auVar16._8_4_ * auVar12._8_4_;
  auVar113._12_4_ = auVar16._12_4_ * auVar12._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar81 * 0x15 + 6);
  auVar12 = vpmovsxwd_avx(auVar16);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar126);
  auVar141._0_4_ = auVar94._0_4_ * auVar12._0_4_;
  auVar141._4_4_ = auVar94._4_4_ * auVar12._4_4_;
  auVar141._8_4_ = auVar94._8_4_ * auVar12._8_4_;
  auVar141._12_4_ = auVar94._12_4_ * auVar12._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar81 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar17);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar126);
  auVar93._0_4_ = auVar94._0_4_ * auVar12._0_4_;
  auVar93._4_4_ = auVar94._4_4_ * auVar12._4_4_;
  auVar93._8_4_ = auVar94._8_4_ * auVar12._8_4_;
  auVar93._12_4_ = auVar94._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar147,auVar155);
  auVar13 = vpminsd_avx(auVar163,auVar113);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  auVar13 = vpminsd_avx(auVar141,auVar93);
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar179._4_4_ = uVar80;
  auVar179._0_4_ = uVar80;
  auVar179._8_4_ = uVar80;
  auVar179._12_4_ = uVar80;
  auVar13 = vmaxps_avx(auVar13,auVar179);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  local_420._0_4_ = auVar12._0_4_ * 0.99999964;
  local_420._4_4_ = auVar12._4_4_ * 0.99999964;
  local_420._8_4_ = auVar12._8_4_ * 0.99999964;
  local_420._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar147,auVar155);
  auVar13 = vpmaxsd_avx(auVar163,auVar113);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar13 = vpmaxsd_avx(auVar141,auVar93);
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar126._4_4_ = uVar80;
  auVar126._0_4_ = uVar80;
  auVar126._8_4_ = uVar80;
  auVar126._12_4_ = uVar80;
  auVar13 = vminps_avx(auVar13,auVar126);
  auVar12 = vminps_avx(auVar12,auVar13);
  auVar94._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar94._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar94._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar94._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar114[4] = PVar8;
  auVar114._5_3_ = 0;
  auVar114[8] = PVar8;
  auVar114._9_3_ = 0;
  auVar114[0xc] = PVar8;
  auVar114._13_3_ = 0;
  auVar13 = vpcmpgtd_avx(auVar114,_DAT_01f4ad30);
  auVar12 = vcmpps_avx(local_420,auVar94,2);
  auVar12 = vandps_avx(auVar12,auVar13);
  uVar85 = vmovmskps_avx(auVar12);
  local_600 = mm_lookupmask_ps._16_8_;
  uStack_5f8 = mm_lookupmask_ps._24_8_;
  uStack_5f0 = mm_lookupmask_ps._16_8_;
  uStack_5e8 = mm_lookupmask_ps._24_8_;
  iVar79 = 1 << ((uint)k & 0x1f);
  auVar96._4_4_ = iVar79;
  auVar96._0_4_ = iVar79;
  auVar96._8_4_ = iVar79;
  auVar96._12_4_ = iVar79;
  auVar96._16_4_ = iVar79;
  auVar96._20_4_ = iVar79;
  auVar96._24_4_ = iVar79;
  auVar96._28_4_ = iVar79;
  auVar196 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar96 = vpand_avx2(auVar96,auVar196);
  local_400 = vpcmpeqd_avx2(auVar96,auVar196);
  for (; local_608 = (ulong)uVar85, local_608 != 0; uVar85 = (uint)uVar87 & uVar85) {
    local_6a0 = auVar198._0_32_;
    lVar89 = 0;
    for (uVar84 = local_608; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
      lVar89 = lVar89 + 1;
    }
    uVar87 = local_608 - 1 & local_608;
    local_660._4_4_ = *(undefined4 *)(prim + lVar89 * 4 + 6);
    uVar84 = (ulong)(uint)((int)lVar89 << 6);
    uVar85 = *(uint *)(prim + 2);
    pGVar9 = (context->scene->geometries).items[uVar85].ptr;
    pPVar1 = prim + uVar84 + uVar81 * 0x19 + 0x16;
    uVar73 = *(undefined8 *)pPVar1;
    uVar74 = *(undefined8 *)(pPVar1 + 8);
    auVar13 = *(undefined1 (*) [16])pPVar1;
    auVar12 = *(undefined1 (*) [16])pPVar1;
    if (uVar87 != 0) {
      uVar86 = uVar87 - 1 & uVar87;
      for (uVar20 = uVar87; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
      }
      if (uVar86 != 0) {
        for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar14 = *(undefined1 (*) [16])(prim + uVar84 + uVar81 * 0x19 + 0x26);
    auVar15 = *(undefined1 (*) [16])(prim + uVar84 + uVar81 * 0x19 + 0x36);
    _local_620 = *(undefined1 (*) [16])(prim + uVar84 + uVar81 * 0x19 + 0x46);
    auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    iVar79 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar93 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar17 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar93);
    uVar80 = auVar17._0_4_;
    auVar148._4_4_ = uVar80;
    auVar148._0_4_ = uVar80;
    auVar148._8_4_ = uVar80;
    auVar148._12_4_ = uVar80;
    auVar16 = vshufps_avx(auVar17,auVar17,0x55);
    auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
    aVar5 = pre->ray_space[k].vx.field_0;
    aVar6 = pre->ray_space[k].vy.field_0;
    fVar125 = pre->ray_space[k].vz.field_0.m128[0];
    fVar124 = pre->ray_space[k].vz.field_0.m128[1];
    fVar106 = pre->ray_space[k].vz.field_0.m128[2];
    fVar107 = pre->ray_space[k].vz.field_0.m128[3];
    auVar164._0_4_ = fVar125 * auVar17._0_4_;
    auVar164._4_4_ = fVar124 * auVar17._4_4_;
    auVar164._8_4_ = fVar106 * auVar17._8_4_;
    auVar164._12_4_ = fVar107 * auVar17._12_4_;
    auVar16 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar6,auVar16);
    auVar113 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar148);
    auVar16 = vblendps_avx(auVar113,*(undefined1 (*) [16])pPVar1,8);
    auVar94 = vsubps_avx(auVar14,auVar93);
    uVar80 = auVar94._0_4_;
    auVar165._4_4_ = uVar80;
    auVar165._0_4_ = uVar80;
    auVar165._8_4_ = uVar80;
    auVar165._12_4_ = uVar80;
    auVar17 = vshufps_avx(auVar94,auVar94,0x55);
    auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
    auVar180._0_4_ = fVar125 * auVar94._0_4_;
    auVar180._4_4_ = fVar124 * auVar94._4_4_;
    auVar180._8_4_ = fVar106 * auVar94._8_4_;
    auVar180._12_4_ = fVar107 * auVar94._12_4_;
    auVar17 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar6,auVar17);
    auVar92 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar165);
    auVar17 = vblendps_avx(auVar92,auVar14,8);
    auVar126 = vsubps_avx(auVar15,auVar93);
    uVar80 = auVar126._0_4_;
    auVar170._4_4_ = uVar80;
    auVar170._0_4_ = uVar80;
    auVar170._8_4_ = uVar80;
    auVar170._12_4_ = uVar80;
    auVar94 = vshufps_avx(auVar126,auVar126,0x55);
    auVar126 = vshufps_avx(auVar126,auVar126,0xaa);
    auVar200._0_4_ = fVar125 * auVar126._0_4_;
    auVar200._4_4_ = fVar124 * auVar126._4_4_;
    auVar200._8_4_ = fVar106 * auVar126._8_4_;
    auVar200._12_4_ = fVar107 * auVar126._12_4_;
    auVar94 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar6,auVar94);
    auVar114 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar5,auVar170);
    auVar94 = vblendps_avx(auVar114,auVar15,8);
    auVar126 = vsubps_avx(_local_620,auVar93);
    uVar80 = auVar126._0_4_;
    auVar171._4_4_ = uVar80;
    auVar171._0_4_ = uVar80;
    auVar171._8_4_ = uVar80;
    auVar171._12_4_ = uVar80;
    auVar93 = vshufps_avx(auVar126,auVar126,0x55);
    auVar126 = vshufps_avx(auVar126,auVar126,0xaa);
    auVar203._0_4_ = fVar125 * auVar126._0_4_;
    auVar203._4_4_ = fVar124 * auVar126._4_4_;
    auVar203._8_4_ = fVar106 * auVar126._8_4_;
    auVar203._12_4_ = fVar107 * auVar126._12_4_;
    auVar93 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar6,auVar93);
    auVar141 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar5,auVar171);
    auVar93 = vblendps_avx(auVar141,_local_620,8);
    auVar16 = vandps_avx(auVar16,local_410);
    auVar17 = vandps_avx(auVar17,local_410);
    auVar126 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vandps_avx(auVar94,local_410);
    auVar17 = vandps_avx(auVar93,local_410);
    auVar16 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar126,auVar16);
    auVar17 = vmovshdup_avx(auVar16);
    auVar17 = vmaxss_avx(auVar17,auVar16);
    auVar16 = vshufpd_avx(auVar16,auVar16,1);
    auVar16 = vmaxss_avx(auVar16,auVar17);
    local_610 = (long)iVar79;
    lVar89 = local_610 * 0x44;
    auVar17 = vmovshdup_avx(auVar113);
    uVar90 = auVar17._0_8_;
    local_5c0._8_8_ = uVar90;
    local_5c0._0_8_ = uVar90;
    local_5c0._16_8_ = uVar90;
    local_5c0._24_8_ = uVar90;
    auVar17 = vmovshdup_avx(auVar92);
    uVar90 = auVar17._0_8_;
    local_440._8_8_ = uVar90;
    local_440._0_8_ = uVar90;
    local_440._16_8_ = uVar90;
    local_440._24_8_ = uVar90;
    auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar89 + 0x908);
    uVar199 = auVar114._0_4_;
    auVar132._4_4_ = uVar199;
    auVar132._0_4_ = uVar199;
    auVar132._8_4_ = uVar199;
    auVar132._12_4_ = uVar199;
    auVar132._16_4_ = uVar199;
    auVar132._20_4_ = uVar199;
    auVar132._24_4_ = uVar199;
    auVar132._28_4_ = uVar199;
    auVar17 = vmovshdup_avx(auVar114);
    uVar90 = auVar17._0_8_;
    auVar181._8_8_ = uVar90;
    auVar181._0_8_ = uVar90;
    auVar181._16_8_ = uVar90;
    auVar181._24_8_ = uVar90;
    fVar125 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar89 + 0xd8c);
    auVar76 = *(undefined1 (*) [28])(bezier_basis0 + lVar89 + 0xd8c);
    fVar202 = auVar141._0_4_;
    auVar17 = vmovshdup_avx(auVar141);
    auVar196._4_4_ = fVar202 * *(float *)(bezier_basis0 + lVar89 + 0xd90);
    auVar196._0_4_ = fVar202 * fVar125;
    auVar196._8_4_ = fVar202 * *(float *)(bezier_basis0 + lVar89 + 0xd94);
    auVar196._12_4_ = fVar202 * *(float *)(bezier_basis0 + lVar89 + 0xd98);
    auVar196._16_4_ = fVar202 * *(float *)(bezier_basis0 + lVar89 + 0xd9c);
    auVar196._20_4_ = fVar202 * *(float *)(bezier_basis0 + lVar89 + 0xda0);
    auVar196._24_4_ = fVar202 * *(float *)(bezier_basis0 + lVar89 + 0xda4);
    auVar196._28_4_ = *(undefined4 *)(bezier_basis0 + lVar89 + 0xda8);
    auVar94 = vfmadd231ps_fma(auVar196,auVar96,auVar132);
    fVar140 = auVar17._0_4_;
    auVar162._0_4_ = fVar140 * fVar125;
    fVar145 = auVar17._4_4_;
    auVar162._4_4_ = fVar145 * *(float *)(bezier_basis0 + lVar89 + 0xd90);
    auVar162._8_4_ = fVar140 * *(float *)(bezier_basis0 + lVar89 + 0xd94);
    auVar162._12_4_ = fVar145 * *(float *)(bezier_basis0 + lVar89 + 0xd98);
    auVar162._16_4_ = fVar140 * *(float *)(bezier_basis0 + lVar89 + 0xd9c);
    auVar162._20_4_ = fVar145 * *(float *)(bezier_basis0 + lVar89 + 0xda0);
    auVar162._24_4_ = fVar140 * *(float *)(bezier_basis0 + lVar89 + 0xda4);
    auVar162._28_4_ = 0;
    auVar17 = vfmadd231ps_fma(auVar162,auVar96,auVar181);
    auVar196 = *(undefined1 (*) [32])(bezier_basis0 + lVar89 + 0x484);
    uVar80 = auVar92._0_4_;
    auVar193._4_4_ = uVar80;
    auVar193._0_4_ = uVar80;
    auVar193._8_4_ = uVar80;
    auVar193._12_4_ = uVar80;
    auVar193._16_4_ = uVar80;
    auVar193._20_4_ = uVar80;
    auVar193._24_4_ = uVar80;
    auVar193._28_4_ = uVar80;
    auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar196,auVar193);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar196,local_440);
    auVar162 = *(undefined1 (*) [32])(bezier_basis0 + lVar89);
    local_580._0_4_ = auVar113._0_4_;
    auVar213._4_4_ = local_580._0_4_;
    auVar213._0_4_ = local_580._0_4_;
    auVar213._8_4_ = local_580._0_4_;
    auVar213._12_4_ = local_580._0_4_;
    auVar213._16_4_ = local_580._0_4_;
    auVar213._20_4_ = local_580._0_4_;
    auVar213._24_4_ = local_580._0_4_;
    auVar213._28_4_ = local_580._0_4_;
    auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar162,auVar213);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar162,local_5c0);
    auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar89 + 0x908);
    fVar124 = *(float *)(bezier_basis1 + lVar89 + 0xd8c);
    fVar106 = *(float *)(bezier_basis1 + lVar89 + 0xd90);
    fVar107 = *(float *)(bezier_basis1 + lVar89 + 0xd94);
    fVar108 = *(float *)(bezier_basis1 + lVar89 + 0xd98);
    fVar109 = *(float *)(bezier_basis1 + lVar89 + 0xd9c);
    fVar110 = *(float *)(bezier_basis1 + lVar89 + 0xda0);
    fVar111 = *(float *)(bezier_basis1 + lVar89 + 0xda4);
    auVar119._4_4_ = fVar202 * fVar106;
    auVar119._0_4_ = fVar202 * fVar124;
    auVar119._8_4_ = fVar202 * fVar107;
    auVar119._12_4_ = fVar202 * fVar108;
    auVar119._16_4_ = fVar202 * fVar109;
    auVar119._20_4_ = fVar202 * fVar110;
    auVar119._24_4_ = fVar202 * fVar111;
    auVar119._28_4_ = *(undefined4 *)(bezier_basis0 + lVar89 + 0xda8);
    auVar93 = vfmadd231ps_fma(auVar119,auVar103,auVar132);
    auVar7._4_4_ = fVar145 * fVar106;
    auVar7._0_4_ = fVar140 * fVar124;
    auVar7._8_4_ = fVar140 * fVar107;
    auVar7._12_4_ = fVar145 * fVar108;
    auVar7._16_4_ = fVar140 * fVar109;
    auVar7._20_4_ = fVar145 * fVar110;
    auVar7._24_4_ = fVar140 * fVar111;
    auVar7._28_4_ = uVar199;
    auVar126 = vfmadd231ps_fma(auVar7,auVar103,auVar181);
    auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar89 + 0x484);
    auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar119,auVar193);
    auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar119,local_440);
    auVar7 = *(undefined1 (*) [32])(bezier_basis1 + lVar89);
    auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar7,auVar213);
    auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar7,local_5c0);
    _local_480 = ZEXT1632(auVar93);
    local_460 = ZEXT1632(auVar94);
    auVar105 = vsubps_avx(_local_480,local_460);
    local_4a0 = ZEXT1632(auVar126);
    local_4c0 = ZEXT1632(auVar17);
    local_4e0 = vsubps_avx(local_4a0,local_4c0);
    auVar97._0_4_ = auVar17._0_4_ * auVar105._0_4_;
    auVar97._4_4_ = auVar17._4_4_ * auVar105._4_4_;
    auVar97._8_4_ = auVar17._8_4_ * auVar105._8_4_;
    auVar97._12_4_ = auVar17._12_4_ * auVar105._12_4_;
    auVar97._16_4_ = auVar105._16_4_ * 0.0;
    auVar97._20_4_ = auVar105._20_4_ * 0.0;
    auVar97._24_4_ = auVar105._24_4_ * 0.0;
    auVar97._28_4_ = 0;
    fVar177 = local_4e0._0_4_;
    auVar115._0_4_ = fVar177 * auVar94._0_4_;
    fVar186 = local_4e0._4_4_;
    auVar115._4_4_ = fVar186 * auVar94._4_4_;
    fVar187 = local_4e0._8_4_;
    auVar115._8_4_ = fVar187 * auVar94._8_4_;
    fVar188 = local_4e0._12_4_;
    auVar115._12_4_ = fVar188 * auVar94._12_4_;
    fVar189 = local_4e0._16_4_;
    auVar115._16_4_ = fVar189 * 0.0;
    fVar190 = local_4e0._20_4_;
    auVar115._20_4_ = fVar190 * 0.0;
    fVar191 = local_4e0._24_4_;
    auVar115._24_4_ = fVar191 * 0.0;
    auVar115._28_4_ = 0;
    auVar97 = vsubps_avx(auVar97,auVar115);
    auVar17 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
    uVar90 = auVar17._0_8_;
    local_80._8_8_ = uVar90;
    local_80._0_8_ = uVar90;
    local_80._16_8_ = uVar90;
    local_80._24_8_ = uVar90;
    auVar94 = vpermilps_avx(auVar14,0xff);
    uVar90 = auVar94._0_8_;
    local_a0._8_8_ = uVar90;
    local_a0._0_8_ = uVar90;
    local_a0._16_8_ = uVar90;
    local_a0._24_8_ = uVar90;
    auVar94 = vpermilps_avx(auVar15,0xff);
    uVar90 = auVar94._0_8_;
    local_c0._8_8_ = uVar90;
    local_c0._0_8_ = uVar90;
    local_c0._16_8_ = uVar90;
    local_c0._24_8_ = uVar90;
    auVar94 = vpermilps_avx(_local_620,0xff);
    local_e0 = auVar94._0_8_;
    local_8e0 = auVar76._0_4_;
    fStack_8dc = auVar76._4_4_;
    fStack_8d8 = auVar76._8_4_;
    fStack_8d4 = auVar76._12_4_;
    fStack_8d0 = auVar76._16_4_;
    fStack_8cc = auVar76._20_4_;
    fStack_8c8 = auVar76._24_4_;
    fVar125 = auVar94._0_4_;
    fVar123 = auVar94._4_4_;
    auVar158._4_4_ = fVar123 * fStack_8dc;
    auVar158._0_4_ = fVar125 * local_8e0;
    auVar158._8_4_ = fVar125 * fStack_8d8;
    auVar158._12_4_ = fVar123 * fStack_8d4;
    auVar158._16_4_ = fVar125 * fStack_8d0;
    auVar158._20_4_ = fVar123 * fStack_8cc;
    auVar158._24_4_ = fVar125 * fStack_8c8;
    auVar158._28_4_ = local_580._0_4_;
    auVar94 = vfmadd231ps_fma(auVar158,local_c0,auVar96);
    auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar196,local_a0);
    auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar162,local_80);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar136._4_4_ = fVar123 * fVar106;
    auVar136._0_4_ = fVar125 * fVar124;
    auVar136._8_4_ = fVar125 * fVar107;
    auVar136._12_4_ = fVar123 * fVar108;
    auVar136._16_4_ = fVar125 * fVar109;
    auVar136._20_4_ = fVar123 * fVar110;
    auVar136._24_4_ = fVar125 * fVar111;
    auVar136._28_4_ = auVar162._28_4_;
    auVar93 = vfmadd231ps_fma(auVar136,auVar103,local_c0);
    auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar119,local_a0);
    auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar7,local_80);
    auVar197._4_4_ = fVar186 * fVar186;
    auVar197._0_4_ = fVar177 * fVar177;
    auVar197._8_4_ = fVar187 * fVar187;
    auVar197._12_4_ = fVar188 * fVar188;
    auVar197._16_4_ = fVar189 * fVar189;
    auVar197._20_4_ = fVar190 * fVar190;
    auVar197._24_4_ = fVar191 * fVar191;
    auVar197._28_4_ = auVar17._4_4_;
    auVar17 = vfmadd231ps_fma(auVar197,auVar105,auVar105);
    auVar158 = vmaxps_avx(ZEXT1632(auVar94),ZEXT1632(auVar93));
    auVar210._4_4_ = auVar158._4_4_ * auVar158._4_4_ * auVar17._4_4_;
    auVar210._0_4_ = auVar158._0_4_ * auVar158._0_4_ * auVar17._0_4_;
    auVar210._8_4_ = auVar158._8_4_ * auVar158._8_4_ * auVar17._8_4_;
    auVar210._12_4_ = auVar158._12_4_ * auVar158._12_4_ * auVar17._12_4_;
    auVar210._16_4_ = auVar158._16_4_ * auVar158._16_4_ * 0.0;
    auVar210._20_4_ = auVar158._20_4_ * auVar158._20_4_ * 0.0;
    auVar210._24_4_ = auVar158._24_4_ * auVar158._24_4_ * 0.0;
    auVar210._28_4_ = auVar158._28_4_;
    auVar19._4_4_ = auVar97._4_4_ * auVar97._4_4_;
    auVar19._0_4_ = auVar97._0_4_ * auVar97._0_4_;
    auVar19._8_4_ = auVar97._8_4_ * auVar97._8_4_;
    auVar19._12_4_ = auVar97._12_4_ * auVar97._12_4_;
    auVar19._16_4_ = auVar97._16_4_ * auVar97._16_4_;
    auVar19._20_4_ = auVar97._20_4_ * auVar97._20_4_;
    auVar19._24_4_ = auVar97._24_4_ * auVar97._24_4_;
    auVar19._28_4_ = auVar97._28_4_;
    auVar158 = vcmpps_avx(auVar19,auVar210,2);
    fVar125 = auVar16._0_4_ * 4.7683716e-07;
    auVar98._0_4_ = (float)iVar79;
    register0x00001504 = auVar141._4_12_;
    auVar98._4_4_ = auVar98._0_4_;
    auVar98._8_4_ = auVar98._0_4_;
    auVar98._12_4_ = auVar98._0_4_;
    auVar98._16_4_ = auVar98._0_4_;
    auVar98._20_4_ = auVar98._0_4_;
    auVar98._24_4_ = auVar98._0_4_;
    auVar98._28_4_ = auVar98._0_4_;
    auVar97 = vcmpps_avx(_DAT_01f7b060,auVar98,1);
    auVar17 = vpermilps_avx(auVar113,0xaa);
    uVar90 = auVar17._0_8_;
    auVar209._8_8_ = uVar90;
    auVar209._0_8_ = uVar90;
    auVar209._16_8_ = uVar90;
    auVar209._24_8_ = uVar90;
    auVar16 = vpermilps_avx(auVar92,0xaa);
    uVar90 = auVar16._0_8_;
    local_3a0._8_8_ = uVar90;
    local_3a0._0_8_ = uVar90;
    local_3a0._16_8_ = uVar90;
    local_3a0._24_8_ = uVar90;
    auVar16 = vpermilps_avx(auVar114,0xaa);
    uVar90 = auVar16._0_8_;
    local_580._8_8_ = uVar90;
    local_580._0_8_ = uVar90;
    local_580._16_8_ = uVar90;
    local_580._24_8_ = uVar90;
    auVar16 = vshufps_avx(auVar141,auVar141,0xaa);
    uVar90 = auVar16._0_8_;
    auVar136 = auVar97 & auVar158;
    uVar4 = *(uint *)(ray + k * 4 + 0x60);
    local_6c0._0_16_ = ZEXT416(uVar4);
    local_5a0._0_16_ = ZEXT416((uint)local_660._4_4_);
    local_730 = auVar14._0_8_;
    uStack_728 = auVar14._8_8_;
    local_740 = auVar15._0_8_;
    uStack_738 = auVar15._8_8_;
    uStack_678 = uVar90;
    uStack_670 = uVar90;
    uStack_668 = uVar90;
    local_560._0_4_ = auVar98._0_4_;
    if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar136 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar136 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar136 >> 0x7f,0) == '\0') &&
          (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar136 >> 0xbf,0) == '\0') &&
        (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar136[0x1f])
    {
      uVar84 = 0;
      auVar173 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,CONCAT416(fVar202,
                                                  CONCAT412(fVar202,CONCAT48(fVar202,CONCAT44(
                                                  fVar202,fVar202))))))));
    }
    else {
      local_5e0 = SUB84(pGVar9,0);
      uStack_5dc = (undefined4)((ulong)pGVar9 >> 0x20);
      _local_500 = vandps_avx(auVar158,auVar97);
      fVar123 = auVar16._0_4_;
      fVar177 = auVar16._4_4_;
      auVar121._4_4_ = fVar177 * fVar106;
      auVar121._0_4_ = fVar123 * fVar124;
      auVar121._8_4_ = fVar123 * fVar107;
      auVar121._12_4_ = fVar177 * fVar108;
      auVar121._16_4_ = fVar123 * fVar109;
      auVar121._20_4_ = fVar177 * fVar110;
      auVar121._24_4_ = fVar123 * fVar111;
      auVar121._28_4_ = local_500._28_4_;
      auVar16 = vfmadd213ps_fma(auVar103,local_580,auVar121);
      auVar16 = vfmadd213ps_fma(auVar119,local_3a0,ZEXT1632(auVar16));
      auVar16 = vfmadd213ps_fma(auVar7,auVar209,ZEXT1632(auVar16));
      auVar99._0_4_ = fVar123 * local_8e0;
      auVar99._4_4_ = fVar177 * fStack_8dc;
      auVar99._8_4_ = fVar123 * fStack_8d8;
      auVar99._12_4_ = fVar177 * fStack_8d4;
      auVar99._16_4_ = fVar123 * fStack_8d0;
      auVar99._20_4_ = fVar177 * fStack_8cc;
      auVar99._24_4_ = fVar123 * fStack_8c8;
      auVar99._28_4_ = 0;
      auVar126 = vfmadd213ps_fma(auVar96,local_580,auVar99);
      auVar126 = vfmadd213ps_fma(auVar196,local_3a0,ZEXT1632(auVar126));
      auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar89 + 0x1210);
      auVar196 = *(undefined1 (*) [32])(bezier_basis0 + lVar89 + 0x1694);
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar89 + 0x1b18);
      fVar124 = *(float *)(bezier_basis0 + lVar89 + 0x1f9c);
      fVar106 = *(float *)(bezier_basis0 + lVar89 + 0x1fa0);
      fVar107 = *(float *)(bezier_basis0 + lVar89 + 0x1fa4);
      fVar108 = *(float *)(bezier_basis0 + lVar89 + 0x1fa8);
      fVar109 = *(float *)(bezier_basis0 + lVar89 + 0x1fac);
      fVar110 = *(float *)(bezier_basis0 + lVar89 + 0x1fb0);
      fVar111 = *(float *)(bezier_basis0 + lVar89 + 0x1fb4);
      auVar18._4_4_ = fVar202 * fVar106;
      auVar18._0_4_ = fVar202 * fVar124;
      auVar18._8_4_ = fVar202 * fVar107;
      auVar18._12_4_ = fVar202 * fVar108;
      auVar18._16_4_ = fVar202 * fVar109;
      auVar18._20_4_ = fVar202 * fVar110;
      auVar18._24_4_ = fVar202 * fVar111;
      auVar18._28_4_ = *(undefined4 *)(bezier_basis1 + lVar89 + 0xda8);
      auVar174._0_4_ = fVar124 * fVar140;
      auVar174._4_4_ = fVar106 * fVar145;
      auVar174._8_4_ = fVar107 * fVar140;
      auVar174._12_4_ = fVar108 * fVar145;
      auVar174._16_4_ = fVar109 * fVar140;
      auVar174._20_4_ = fVar110 * fVar145;
      auVar174._24_4_ = fVar111 * fVar140;
      auVar174._28_4_ = 0;
      auVar172._4_4_ = fVar177 * fVar106;
      auVar172._0_4_ = fVar123 * fVar124;
      auVar172._8_4_ = fVar123 * fVar107;
      auVar172._12_4_ = fVar177 * fVar108;
      auVar172._16_4_ = fVar123 * fVar109;
      auVar172._20_4_ = fVar177 * fVar110;
      auVar172._24_4_ = fVar123 * fVar111;
      auVar172._28_4_ = auVar105._28_4_;
      auVar113 = vfmadd231ps_fma(auVar18,auVar103,auVar132);
      auVar92 = vfmadd231ps_fma(auVar174,auVar103,auVar181);
      auVar114 = vfmadd231ps_fma(auVar172,local_580,auVar103);
      auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar196,auVar193);
      auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar196,local_440);
      auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),local_3a0,auVar196);
      auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar96,auVar213);
      auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar96,local_5c0);
      auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar209,auVar96);
      fVar124 = *(float *)(bezier_basis1 + lVar89 + 0x1f9c);
      fVar106 = *(float *)(bezier_basis1 + lVar89 + 0x1fa0);
      fVar107 = *(float *)(bezier_basis1 + lVar89 + 0x1fa4);
      fVar108 = *(float *)(bezier_basis1 + lVar89 + 0x1fa8);
      fVar109 = *(float *)(bezier_basis1 + lVar89 + 0x1fac);
      fVar110 = *(float *)(bezier_basis1 + lVar89 + 0x1fb0);
      fVar111 = *(float *)(bezier_basis1 + lVar89 + 0x1fb4);
      auVar103._4_4_ = fVar202 * fVar106;
      auVar103._0_4_ = fVar202 * fVar124;
      auVar103._8_4_ = fVar202 * fVar107;
      auVar103._12_4_ = fVar202 * fVar108;
      auVar103._16_4_ = fVar202 * fVar109;
      auVar103._20_4_ = fVar202 * fVar110;
      auVar103._24_4_ = fVar202 * fVar111;
      auVar103._28_4_ = fVar202;
      auVar214._4_4_ = fVar145 * fVar106;
      auVar214._0_4_ = fVar140 * fVar124;
      auVar214._8_4_ = fVar140 * fVar107;
      auVar214._12_4_ = fVar145 * fVar108;
      auVar214._16_4_ = fVar140 * fVar109;
      auVar214._20_4_ = fVar145 * fVar110;
      auVar214._24_4_ = fVar140 * fVar111;
      auVar214._28_4_ = fVar177;
      auVar21._4_4_ = fVar177 * fVar106;
      auVar21._0_4_ = fVar123 * fVar124;
      auVar21._8_4_ = fVar123 * fVar107;
      auVar21._12_4_ = fVar177 * fVar108;
      auVar21._16_4_ = fVar123 * fVar109;
      auVar21._20_4_ = fVar177 * fVar110;
      auVar21._24_4_ = fVar123 * fVar111;
      auVar21._28_4_ = auVar17._4_4_;
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar89 + 0x1b18);
      auVar17 = vfmadd231ps_fma(auVar103,auVar96,auVar132);
      auVar141 = vfmadd231ps_fma(auVar214,auVar96,auVar181);
      auVar147 = vfmadd231ps_fma(auVar21,auVar96,local_580);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar89 + 0x1694);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar96,auVar193);
      auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar96,local_440);
      auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),local_3a0,auVar96);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar89 + 0x1210);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar96,auVar213);
      auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar96,local_5c0);
      auVar116._8_4_ = 0x7fffffff;
      auVar116._0_8_ = 0x7fffffff7fffffff;
      auVar116._12_4_ = 0x7fffffff;
      auVar116._16_4_ = 0x7fffffff;
      auVar116._20_4_ = 0x7fffffff;
      auVar116._24_4_ = 0x7fffffff;
      auVar116._28_4_ = 0x7fffffff;
      auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar209,auVar96);
      auVar96 = vandps_avx(ZEXT1632(auVar113),auVar116);
      auVar196 = vandps_avx(ZEXT1632(auVar92),auVar116);
      auVar196 = vmaxps_avx(auVar96,auVar196);
      auVar96 = vandps_avx(ZEXT1632(auVar114),auVar116);
      auVar96 = vmaxps_avx(auVar196,auVar96);
      auVar133._4_4_ = fVar125;
      auVar133._0_4_ = fVar125;
      auVar133._8_4_ = fVar125;
      auVar133._12_4_ = fVar125;
      auVar133._16_4_ = fVar125;
      auVar133._20_4_ = fVar125;
      auVar133._24_4_ = fVar125;
      auVar133._28_4_ = fVar125;
      auVar96 = vcmpps_avx(auVar96,auVar133,1);
      auVar103 = vblendvps_avx(ZEXT1632(auVar113),auVar105,auVar96);
      auVar119 = vblendvps_avx(ZEXT1632(auVar92),local_4e0,auVar96);
      auVar96 = vandps_avx(ZEXT1632(auVar17),auVar116);
      auVar196 = vandps_avx(ZEXT1632(auVar141),auVar116);
      auVar7 = vmaxps_avx(auVar96,auVar196);
      auVar96 = vandps_avx(ZEXT1632(auVar147),auVar116);
      auVar96 = vmaxps_avx(auVar7,auVar96);
      auVar158 = vcmpps_avx(auVar96,auVar133,1);
      auVar96 = vblendvps_avx(ZEXT1632(auVar17),auVar105,auVar158);
      auVar7 = vblendvps_avx(ZEXT1632(auVar141),local_4e0,auVar158);
      auVar17 = vfmadd213ps_fma(auVar162,auVar209,ZEXT1632(auVar126));
      auVar126 = vfmadd213ps_fma(auVar103,auVar103,ZEXT832(0) << 0x20);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar119,auVar119);
      auVar162 = vrsqrtps_avx(ZEXT1632(auVar126));
      fVar124 = auVar162._0_4_;
      fVar106 = auVar162._4_4_;
      fVar107 = auVar162._8_4_;
      fVar108 = auVar162._12_4_;
      fVar109 = auVar162._16_4_;
      fVar110 = auVar162._20_4_;
      fVar111 = auVar162._24_4_;
      auVar105._4_4_ = fVar106 * fVar106 * fVar106 * auVar126._4_4_ * -0.5;
      auVar105._0_4_ = fVar124 * fVar124 * fVar124 * auVar126._0_4_ * -0.5;
      auVar105._8_4_ = fVar107 * fVar107 * fVar107 * auVar126._8_4_ * -0.5;
      auVar105._12_4_ = fVar108 * fVar108 * fVar108 * auVar126._12_4_ * -0.5;
      auVar105._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
      auVar105._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
      auVar105._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
      auVar105._28_4_ = auVar196._28_4_;
      auVar151._8_4_ = 0x3fc00000;
      auVar151._0_8_ = 0x3fc000003fc00000;
      auVar151._12_4_ = 0x3fc00000;
      auVar151._16_4_ = 0x3fc00000;
      auVar151._20_4_ = 0x3fc00000;
      auVar151._24_4_ = 0x3fc00000;
      auVar151._28_4_ = 0x3fc00000;
      auVar126 = vfmadd231ps_fma(auVar105,auVar151,auVar162);
      fVar124 = auVar126._0_4_;
      fVar106 = auVar126._4_4_;
      auVar22._4_4_ = fVar106 * auVar119._4_4_;
      auVar22._0_4_ = fVar124 * auVar119._0_4_;
      fVar107 = auVar126._8_4_;
      auVar22._8_4_ = fVar107 * auVar119._8_4_;
      fVar108 = auVar126._12_4_;
      auVar22._12_4_ = fVar108 * auVar119._12_4_;
      auVar22._16_4_ = auVar119._16_4_ * 0.0;
      auVar22._20_4_ = auVar119._20_4_ * 0.0;
      auVar22._24_4_ = auVar119._24_4_ * 0.0;
      auVar22._28_4_ = 0;
      auVar23._4_4_ = fVar106 * -auVar103._4_4_;
      auVar23._0_4_ = fVar124 * -auVar103._0_4_;
      auVar23._8_4_ = fVar107 * -auVar103._8_4_;
      auVar23._12_4_ = fVar108 * -auVar103._12_4_;
      auVar23._16_4_ = -auVar103._16_4_ * 0.0;
      auVar23._20_4_ = -auVar103._20_4_ * 0.0;
      auVar23._24_4_ = -auVar103._24_4_ * 0.0;
      auVar23._28_4_ = auVar162._28_4_;
      auVar126 = vfmadd213ps_fma(auVar96,auVar96,ZEXT832(0) << 0x20);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar7,auVar7);
      auVar196 = vrsqrtps_avx(ZEXT1632(auVar126));
      auVar24._28_4_ = auVar158._28_4_;
      auVar24._0_28_ =
           ZEXT1628(CONCAT412(fVar108 * 0.0,
                              CONCAT48(fVar107 * 0.0,CONCAT44(fVar106 * 0.0,fVar124 * 0.0))));
      fVar124 = auVar196._0_4_;
      fVar106 = auVar196._4_4_;
      fVar107 = auVar196._8_4_;
      fVar108 = auVar196._12_4_;
      fVar109 = auVar196._16_4_;
      fVar110 = auVar196._20_4_;
      fVar111 = auVar196._24_4_;
      auVar25._4_4_ = fVar106 * fVar106 * fVar106 * auVar126._4_4_ * -0.5;
      auVar25._0_4_ = fVar124 * fVar124 * fVar124 * auVar126._0_4_ * -0.5;
      auVar25._8_4_ = fVar107 * fVar107 * fVar107 * auVar126._8_4_ * -0.5;
      auVar25._12_4_ = fVar108 * fVar108 * fVar108 * auVar126._12_4_ * -0.5;
      auVar25._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
      auVar25._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
      auVar25._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
      auVar25._28_4_ = 0;
      auVar126 = vfmadd231ps_fma(auVar25,auVar151,auVar196);
      fVar124 = auVar126._0_4_;
      auVar194._0_4_ = auVar7._0_4_ * fVar124;
      fVar106 = auVar126._4_4_;
      auVar194._4_4_ = auVar7._4_4_ * fVar106;
      fVar107 = auVar126._8_4_;
      auVar194._8_4_ = auVar7._8_4_ * fVar107;
      fVar108 = auVar126._12_4_;
      auVar194._12_4_ = auVar7._12_4_ * fVar108;
      auVar194._16_4_ = auVar7._16_4_ * 0.0;
      auVar194._20_4_ = auVar7._20_4_ * 0.0;
      auVar194._24_4_ = auVar7._24_4_ * 0.0;
      auVar194._28_4_ = 0;
      auVar26._4_4_ = -auVar96._4_4_ * fVar106;
      auVar26._0_4_ = -auVar96._0_4_ * fVar124;
      auVar26._8_4_ = -auVar96._8_4_ * fVar107;
      auVar26._12_4_ = -auVar96._12_4_ * fVar108;
      auVar26._16_4_ = -auVar96._16_4_ * 0.0;
      auVar26._20_4_ = -auVar96._20_4_ * 0.0;
      auVar26._24_4_ = -auVar96._24_4_ * 0.0;
      auVar26._28_4_ = auVar7._28_4_;
      auVar27._28_4_ = auVar196._28_4_;
      auVar27._0_28_ =
           ZEXT1628(CONCAT412(fVar108 * 0.0,
                              CONCAT48(fVar107 * 0.0,CONCAT44(fVar106 * 0.0,fVar124 * 0.0))));
      auVar126 = vfmadd213ps_fma(auVar22,ZEXT1632(auVar94),local_460);
      auVar96 = ZEXT1632(auVar94);
      auVar113 = vfmadd213ps_fma(auVar23,auVar96,local_4c0);
      auVar92 = vfmadd213ps_fma(auVar24,auVar96,ZEXT1632(auVar17));
      auVar141 = vfnmadd213ps_fma(auVar22,auVar96,local_460);
      auVar114 = vfmadd213ps_fma(auVar194,ZEXT1632(auVar93),_local_480);
      auVar147 = vfnmadd213ps_fma(auVar23,auVar96,local_4c0);
      auVar172 = ZEXT1632(auVar93);
      auVar93 = vfmadd213ps_fma(auVar26,auVar172,local_4a0);
      auVar214 = ZEXT1632(auVar94);
      auVar146 = vfnmadd231ps_fma(ZEXT1632(auVar17),auVar214,auVar24);
      auVar17 = vfmadd213ps_fma(auVar27,auVar172,ZEXT1632(auVar16));
      auVar91 = vfnmadd213ps_fma(auVar194,auVar172,_local_480);
      auVar112 = vfnmadd213ps_fma(auVar26,auVar172,local_4a0);
      auVar153 = vfnmadd231ps_fma(ZEXT1632(auVar16),auVar172,auVar27);
      auVar96 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar147));
      auVar196 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar146));
      auVar28._4_4_ = auVar146._4_4_ * auVar96._4_4_;
      auVar28._0_4_ = auVar146._0_4_ * auVar96._0_4_;
      auVar28._8_4_ = auVar146._8_4_ * auVar96._8_4_;
      auVar28._12_4_ = auVar146._12_4_ * auVar96._12_4_;
      auVar28._16_4_ = auVar96._16_4_ * 0.0;
      auVar28._20_4_ = auVar96._20_4_ * 0.0;
      auVar28._24_4_ = auVar96._24_4_ * 0.0;
      auVar28._28_4_ = 0;
      auVar94 = vfmsub231ps_fma(auVar28,ZEXT1632(auVar147),auVar196);
      auVar29._4_4_ = auVar196._4_4_ * auVar141._4_4_;
      auVar29._0_4_ = auVar196._0_4_ * auVar141._0_4_;
      auVar29._8_4_ = auVar196._8_4_ * auVar141._8_4_;
      auVar29._12_4_ = auVar196._12_4_ * auVar141._12_4_;
      auVar29._16_4_ = auVar196._16_4_ * 0.0;
      auVar29._20_4_ = auVar196._20_4_ * 0.0;
      auVar29._24_4_ = auVar196._24_4_ * 0.0;
      auVar29._28_4_ = auVar196._28_4_;
      auVar196 = vsubps_avx(ZEXT1632(auVar114),ZEXT1632(auVar141));
      auVar16 = vfmsub231ps_fma(auVar29,ZEXT1632(auVar146),auVar196);
      auVar30._4_4_ = auVar147._4_4_ * auVar196._4_4_;
      auVar30._0_4_ = auVar147._0_4_ * auVar196._0_4_;
      auVar30._8_4_ = auVar147._8_4_ * auVar196._8_4_;
      auVar30._12_4_ = auVar147._12_4_ * auVar196._12_4_;
      auVar30._16_4_ = auVar196._16_4_ * 0.0;
      auVar30._20_4_ = auVar196._20_4_ * 0.0;
      auVar30._24_4_ = auVar196._24_4_ * 0.0;
      auVar30._28_4_ = auVar196._28_4_;
      auVar158 = ZEXT1632(auVar141);
      auVar141 = vfmsub231ps_fma(auVar30,auVar158,auVar96);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar141),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar94));
      auVar136 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,2);
      auVar96 = vblendvps_avx(ZEXT1632(auVar91),ZEXT1632(auVar126),auVar136);
      auVar196 = vblendvps_avx(ZEXT1632(auVar112),ZEXT1632(auVar113),auVar136);
      auVar162 = vblendvps_avx(ZEXT1632(auVar153),ZEXT1632(auVar92),auVar136);
      auVar103 = vblendvps_avx(auVar158,ZEXT1632(auVar114),auVar136);
      auVar119 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar93),auVar136);
      auVar7 = vblendvps_avx(ZEXT1632(auVar146),ZEXT1632(auVar17),auVar136);
      auVar158 = vblendvps_avx(ZEXT1632(auVar114),auVar158,auVar136);
      auVar97 = vblendvps_avx(ZEXT1632(auVar93),ZEXT1632(auVar147),auVar136);
      auVar16 = vpackssdw_avx(local_500._0_16_,local_500._16_16_);
      auVar105 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar146),auVar136);
      auVar197 = vsubps_avx(auVar158,auVar96);
      auVar210 = vsubps_avx(auVar97,auVar196);
      auVar19 = vsubps_avx(auVar105,auVar162);
      auVar115 = vsubps_avx(auVar96,auVar103);
      auVar121 = vsubps_avx(auVar196,auVar119);
      auVar18 = vsubps_avx(auVar162,auVar7);
      auVar31._4_4_ = auVar19._4_4_ * auVar96._4_4_;
      auVar31._0_4_ = auVar19._0_4_ * auVar96._0_4_;
      auVar31._8_4_ = auVar19._8_4_ * auVar96._8_4_;
      auVar31._12_4_ = auVar19._12_4_ * auVar96._12_4_;
      auVar31._16_4_ = auVar19._16_4_ * auVar96._16_4_;
      auVar31._20_4_ = auVar19._20_4_ * auVar96._20_4_;
      auVar31._24_4_ = auVar19._24_4_ * auVar96._24_4_;
      auVar31._28_4_ = auVar105._28_4_;
      auVar17 = vfmsub231ps_fma(auVar31,auVar162,auVar197);
      auVar32._4_4_ = auVar197._4_4_ * auVar196._4_4_;
      auVar32._0_4_ = auVar197._0_4_ * auVar196._0_4_;
      auVar32._8_4_ = auVar197._8_4_ * auVar196._8_4_;
      auVar32._12_4_ = auVar197._12_4_ * auVar196._12_4_;
      auVar32._16_4_ = auVar197._16_4_ * auVar196._16_4_;
      auVar32._20_4_ = auVar197._20_4_ * auVar196._20_4_;
      auVar32._24_4_ = auVar197._24_4_ * auVar196._24_4_;
      auVar32._28_4_ = auVar158._28_4_;
      auVar94 = vfmsub231ps_fma(auVar32,auVar96,auVar210);
      auVar66 = ZEXT812(0);
      auVar195 = ZEXT1232(auVar66) << 0x20;
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT1232(auVar66) << 0x20,ZEXT1632(auVar17));
      auVar100._0_4_ = auVar210._0_4_ * auVar162._0_4_;
      auVar100._4_4_ = auVar210._4_4_ * auVar162._4_4_;
      auVar100._8_4_ = auVar210._8_4_ * auVar162._8_4_;
      auVar100._12_4_ = auVar210._12_4_ * auVar162._12_4_;
      auVar100._16_4_ = auVar210._16_4_ * auVar162._16_4_;
      auVar100._20_4_ = auVar210._20_4_ * auVar162._20_4_;
      auVar100._24_4_ = auVar210._24_4_ * auVar162._24_4_;
      auVar100._28_4_ = 0;
      auVar94 = vfmsub231ps_fma(auVar100,auVar196,auVar19);
      auVar94 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1232(auVar66) << 0x20,ZEXT1632(auVar94));
      auVar101._0_4_ = auVar18._0_4_ * auVar103._0_4_;
      auVar101._4_4_ = auVar18._4_4_ * auVar103._4_4_;
      auVar101._8_4_ = auVar18._8_4_ * auVar103._8_4_;
      auVar101._12_4_ = auVar18._12_4_ * auVar103._12_4_;
      auVar101._16_4_ = auVar18._16_4_ * auVar103._16_4_;
      auVar101._20_4_ = auVar18._20_4_ * auVar103._20_4_;
      auVar101._24_4_ = auVar18._24_4_ * auVar103._24_4_;
      auVar101._28_4_ = 0;
      auVar17 = vfmsub231ps_fma(auVar101,auVar115,auVar7);
      auVar33._4_4_ = auVar121._4_4_ * auVar7._4_4_;
      auVar33._0_4_ = auVar121._0_4_ * auVar7._0_4_;
      auVar33._8_4_ = auVar121._8_4_ * auVar7._8_4_;
      auVar33._12_4_ = auVar121._12_4_ * auVar7._12_4_;
      auVar33._16_4_ = auVar121._16_4_ * auVar7._16_4_;
      auVar33._20_4_ = auVar121._20_4_ * auVar7._20_4_;
      auVar33._24_4_ = auVar121._24_4_ * auVar7._24_4_;
      auVar33._28_4_ = auVar7._28_4_;
      auVar93 = vfmsub231ps_fma(auVar33,auVar119,auVar18);
      auVar34._4_4_ = auVar115._4_4_ * auVar119._4_4_;
      auVar34._0_4_ = auVar115._0_4_ * auVar119._0_4_;
      auVar34._8_4_ = auVar115._8_4_ * auVar119._8_4_;
      auVar34._12_4_ = auVar115._12_4_ * auVar119._12_4_;
      auVar34._16_4_ = auVar115._16_4_ * auVar119._16_4_;
      auVar34._20_4_ = auVar115._20_4_ * auVar119._20_4_;
      auVar34._24_4_ = auVar115._24_4_ * auVar119._24_4_;
      auVar34._28_4_ = auVar97._28_4_;
      auVar126 = vfmsub231ps_fma(auVar34,auVar121,auVar103);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar126),ZEXT1232(auVar66) << 0x20,ZEXT1632(auVar17));
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1232(auVar66) << 0x20,ZEXT1632(auVar93));
      auVar103 = vmaxps_avx(ZEXT1632(auVar94),ZEXT1632(auVar93));
      auVar103 = vcmpps_avx(auVar103,ZEXT832(0) << 0x20,2);
      auVar17 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
      auVar16 = vpand_avx(auVar17,auVar16);
      auVar103 = vpmovsxwd_avx2(auVar16);
      if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar103 >> 0x7f,0) == '\0') &&
            (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar103 >> 0xbf,0) == '\0') &&
          (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar103[0x1f]) {
        auVar198 = ZEXT864(0) << 0x20;
LAB_01103ea4:
        auVar173 = ZEXT3264(CONCAT824(uStack_5e8,
                                      CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
        auVar96 = vpcmpeqd_avx2(auVar195,auVar195);
        auVar139 = ZEXT3264(auVar96);
      }
      else {
        auVar35._4_4_ = auVar210._4_4_ * auVar18._4_4_;
        auVar35._0_4_ = auVar210._0_4_ * auVar18._0_4_;
        auVar35._8_4_ = auVar210._8_4_ * auVar18._8_4_;
        auVar35._12_4_ = auVar210._12_4_ * auVar18._12_4_;
        auVar35._16_4_ = auVar210._16_4_ * auVar18._16_4_;
        auVar35._20_4_ = auVar210._20_4_ * auVar18._20_4_;
        auVar35._24_4_ = auVar210._24_4_ * auVar18._24_4_;
        auVar35._28_4_ = auVar103._28_4_;
        auVar92 = vfmsub231ps_fma(auVar35,auVar121,auVar19);
        auVar117._0_4_ = auVar19._0_4_ * auVar115._0_4_;
        auVar117._4_4_ = auVar19._4_4_ * auVar115._4_4_;
        auVar117._8_4_ = auVar19._8_4_ * auVar115._8_4_;
        auVar117._12_4_ = auVar19._12_4_ * auVar115._12_4_;
        auVar117._16_4_ = auVar19._16_4_ * auVar115._16_4_;
        auVar117._20_4_ = auVar19._20_4_ * auVar115._20_4_;
        auVar117._24_4_ = auVar19._24_4_ * auVar115._24_4_;
        auVar117._28_4_ = 0;
        auVar113 = vfmsub231ps_fma(auVar117,auVar197,auVar18);
        auVar36._4_4_ = auVar197._4_4_ * auVar121._4_4_;
        auVar36._0_4_ = auVar197._0_4_ * auVar121._0_4_;
        auVar36._8_4_ = auVar197._8_4_ * auVar121._8_4_;
        auVar36._12_4_ = auVar197._12_4_ * auVar121._12_4_;
        auVar36._16_4_ = auVar197._16_4_ * auVar121._16_4_;
        auVar36._20_4_ = auVar197._20_4_ * auVar121._20_4_;
        auVar36._24_4_ = auVar197._24_4_ * auVar121._24_4_;
        auVar36._28_4_ = auVar119._28_4_;
        auVar114 = vfmsub231ps_fma(auVar36,auVar115,auVar210);
        auVar17 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar113),ZEXT1632(auVar114));
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar92),_DAT_01f7b000);
        auVar103 = vrcpps_avx(ZEXT1632(auVar126));
        auVar195._8_4_ = 0x3f800000;
        auVar195._0_8_ = 0x3f8000003f800000;
        auVar195._12_4_ = 0x3f800000;
        auVar195._16_4_ = 0x3f800000;
        auVar195._20_4_ = 0x3f800000;
        auVar195._24_4_ = 0x3f800000;
        auVar195._28_4_ = 0x3f800000;
        auVar17 = vfnmadd213ps_fma(auVar103,ZEXT1632(auVar126),auVar195);
        auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar103,auVar103);
        auVar166._0_4_ = auVar114._0_4_ * auVar162._0_4_;
        auVar166._4_4_ = auVar114._4_4_ * auVar162._4_4_;
        auVar166._8_4_ = auVar114._8_4_ * auVar162._8_4_;
        auVar166._12_4_ = auVar114._12_4_ * auVar162._12_4_;
        auVar166._16_4_ = auVar162._16_4_ * 0.0;
        auVar166._20_4_ = auVar162._20_4_ * 0.0;
        auVar166._24_4_ = auVar162._24_4_ * 0.0;
        auVar166._28_4_ = 0;
        auVar113 = vfmadd231ps_fma(auVar166,auVar196,ZEXT1632(auVar113));
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),ZEXT1632(auVar92),auVar96);
        fVar124 = auVar17._0_4_;
        fVar106 = auVar17._4_4_;
        fVar107 = auVar17._8_4_;
        fVar108 = auVar17._12_4_;
        auVar162 = ZEXT1632(CONCAT412(fVar108 * auVar113._12_4_,
                                      CONCAT48(fVar107 * auVar113._8_4_,
                                               CONCAT44(fVar106 * auVar113._4_4_,
                                                        fVar124 * auVar113._0_4_))));
        auVar102._4_4_ = uVar4;
        auVar102._0_4_ = uVar4;
        auVar102._8_4_ = uVar4;
        auVar102._12_4_ = uVar4;
        auVar102._16_4_ = uVar4;
        auVar102._20_4_ = uVar4;
        auVar102._24_4_ = uVar4;
        auVar102._28_4_ = uVar4;
        uVar80 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar118._4_4_ = uVar80;
        auVar118._0_4_ = uVar80;
        auVar118._8_4_ = uVar80;
        auVar118._12_4_ = uVar80;
        auVar118._16_4_ = uVar80;
        auVar118._20_4_ = uVar80;
        auVar118._24_4_ = uVar80;
        auVar118._28_4_ = uVar80;
        auVar96 = vcmpps_avx(auVar102,auVar162,2);
        auVar196 = vcmpps_avx(auVar162,auVar118,2);
        auVar96 = vandps_avx(auVar196,auVar96);
        auVar17 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
        auVar16 = vpand_avx(auVar16,auVar17);
        auVar96 = vpmovsxwd_avx2(auVar16);
        auVar198 = ZEXT864(0) << 0x20;
        if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar96 >> 0x7f,0) == '\0') &&
              (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar96 >> 0xbf,0) == '\0') &&
            (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar96[0x1f]) goto LAB_01103ea4;
        auVar96 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar126),4);
        auVar17 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
        auVar16 = vpand_avx(auVar16,auVar17);
        auVar196 = vpmovsxwd_avx2(auVar16);
        auVar173 = ZEXT3264(CONCAT824(uStack_5e8,
                                      CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
        auVar96 = vpcmpeqd_avx2(auVar195,auVar195);
        auVar139 = ZEXT3264(auVar96);
        if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar196 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar196 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar196 >> 0x7f,0) != '\0') ||
              (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar196 >> 0xbf,0) != '\0') ||
            (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar196[0x1f] < '\0') {
          auVar103 = ZEXT1632(CONCAT412(fVar108 * auVar94._12_4_,
                                        CONCAT48(fVar107 * auVar94._8_4_,
                                                 CONCAT44(fVar106 * auVar94._4_4_,
                                                          fVar124 * auVar94._0_4_))));
          auVar119 = ZEXT1632(CONCAT412(fVar108 * auVar93._12_4_,
                                        CONCAT48(fVar107 * auVar93._8_4_,
                                                 CONCAT44(fVar106 * auVar93._4_4_,
                                                          fVar124 * auVar93._0_4_))));
          auVar152._8_4_ = 0x3f800000;
          auVar152._0_8_ = 0x3f8000003f800000;
          auVar152._12_4_ = 0x3f800000;
          auVar152._16_4_ = 0x3f800000;
          auVar152._20_4_ = 0x3f800000;
          auVar152._24_4_ = 0x3f800000;
          auVar152._28_4_ = 0x3f800000;
          auVar96 = vsubps_avx(auVar152,auVar103);
          _local_3c0 = vblendvps_avx(auVar96,auVar103,auVar136);
          auVar96 = vsubps_avx(auVar152,auVar119);
          local_520 = vblendvps_avx(auVar96,auVar119,auVar136);
          auVar173 = ZEXT3264(auVar196);
          local_3e0 = auVar162;
        }
      }
      auVar185 = ZEXT3264(auVar209);
      auVar96 = auVar173._0_32_;
      if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar96 >> 0x7f,0) == '\0') &&
            (auVar173 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar96 >> 0xbf,0) == '\0') &&
          (auVar173 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar173[0x1f]) {
        auVar173 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,CONCAT416(fVar202,
                                                  CONCAT412(fVar202,CONCAT48(fVar202,CONCAT44(
                                                  fVar202,fVar202))))))));
      }
      else {
        auVar196 = vsubps_avx(auVar172,auVar214);
        auVar16 = vfmadd213ps_fma(auVar196,_local_3c0,auVar214);
        fVar124 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar37._4_4_ = (auVar16._4_4_ + auVar16._4_4_) * fVar124;
        auVar37._0_4_ = (auVar16._0_4_ + auVar16._0_4_) * fVar124;
        auVar37._8_4_ = (auVar16._8_4_ + auVar16._8_4_) * fVar124;
        auVar37._12_4_ = (auVar16._12_4_ + auVar16._12_4_) * fVar124;
        auVar37._16_4_ = fVar124 * 0.0;
        auVar37._20_4_ = fVar124 * 0.0;
        auVar37._24_4_ = fVar124 * 0.0;
        auVar37._28_4_ = 0;
        auVar196 = vcmpps_avx(local_3e0,auVar37,6);
        auVar162 = auVar96 & auVar196;
        auVar173 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,CONCAT416(fVar202,
                                                  CONCAT412(fVar202,CONCAT48(fVar202,CONCAT44(
                                                  fVar202,fVar202))))))));
        if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar162 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar162 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar162 >> 0x7f,0) != '\0') ||
              (auVar162 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar162 >> 0xbf,0) != '\0') ||
            (auVar162 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar162[0x1f] < '\0') {
          auVar120._8_4_ = 0xbf800000;
          auVar120._0_8_ = 0xbf800000bf800000;
          auVar120._12_4_ = 0xbf800000;
          auVar120._16_4_ = 0xbf800000;
          auVar120._20_4_ = 0xbf800000;
          auVar120._24_4_ = 0xbf800000;
          auVar120._28_4_ = 0xbf800000;
          auVar134._8_4_ = 0x40000000;
          auVar134._0_8_ = 0x4000000040000000;
          auVar134._12_4_ = 0x40000000;
          auVar134._16_4_ = 0x40000000;
          auVar134._20_4_ = 0x40000000;
          auVar134._24_4_ = 0x40000000;
          auVar134._28_4_ = 0x40000000;
          auVar16 = vfmadd213ps_fma(local_520,auVar134,auVar120);
          local_380 = _local_3c0;
          local_360 = ZEXT1632(auVar16);
          local_340 = local_3e0;
          local_320 = 0;
          local_300 = local_730;
          uStack_2f8 = uStack_728;
          local_2f0 = local_740;
          uStack_2e8 = uStack_738;
          local_520 = local_360;
          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            uVar84 = 0;
          }
          else {
            pGVar82 = (Geometry *)context->args;
            if ((((Geometry *)context->args)->device != (Device *)0x0) ||
               (uVar84 = CONCAT71((int7)((ulong)pGVar9 >> 8),1), pGVar82 = pGVar9,
               pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar96 = vandps_avx(auVar196,auVar96);
              fVar124 = 1.0 / auVar98._0_4_;
              local_2a0[0] = fVar124 * ((float)local_3c0._0_4_ + 0.0);
              local_2a0[1] = fVar124 * ((float)local_3c0._4_4_ + 1.0);
              local_2a0[2] = fVar124 * (fStack_3b8 + 2.0);
              local_2a0[3] = fVar124 * (fStack_3b4 + 3.0);
              fStack_290 = fVar124 * (fStack_3b0 + 4.0);
              fStack_28c = fVar124 * (fStack_3ac + 5.0);
              fStack_288 = fVar124 * (fStack_3a8 + 6.0);
              fStack_284 = fStack_3a4 + 7.0;
              local_520._0_8_ = auVar16._0_8_;
              local_520._8_8_ = auVar16._8_8_;
              local_280 = local_520._0_8_;
              uStack_278 = local_520._8_8_;
              uStack_270 = 0;
              uStack_268 = 0;
              local_260 = local_3e0;
              uVar80 = vmovmskps_avx(auVar96);
              uVar84 = 0;
              uVar86 = CONCAT44((int)((ulong)pGVar82 >> 0x20),uVar80);
              for (uVar20 = uVar86; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                uVar84 = uVar84 + 1;
              }
              local_7e0 = CONCAT44(uVar85,uVar85);
              uStack_7d8._0_4_ = uVar85;
              uStack_7d8._4_4_ = uVar85;
              uStack_7d0._0_4_ = uVar85;
              uStack_7d0._4_4_ = uVar85;
              auVar78 = _local_7e0;
              uStack_7c8._0_4_ = uVar85;
              uStack_7c8._4_4_ = uVar85;
              auVar96 = _local_7e0;
              local_660._0_4_ = local_660._4_4_;
              local_660._8_4_ = local_660._4_4_;
              local_660._12_4_ = local_660._4_4_;
              local_660._16_4_ = local_660._4_4_;
              local_660._20_4_ = local_660._4_4_;
              local_660._24_4_ = local_660._4_4_;
              local_660._28_4_ = local_660._4_4_;
              uVar206 = uVar90;
              uVar207 = uVar90;
              uVar208 = uVar90;
              local_6e0 = auVar209;
              local_680 = uVar90;
              local_31c = iVar79;
              local_310 = uVar73;
              uStack_308 = uVar74;
              while (auVar209 = auVar185._0_32_, uVar86 != 0) {
                uVar80 = *(undefined4 *)(ray + k * 4 + 0x100);
                local_1e0 = local_2a0[uVar84];
                local_1c0 = *(undefined4 *)((long)&local_280 + uVar84 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_260 + uVar84 * 4);
                fVar107 = 1.0 - local_1e0;
                auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar107 * fVar107)),
                                          ZEXT416((uint)(local_1e0 * fVar107)),ZEXT416(0xc0000000));
                auVar16 = vfmsub132ss_fma(ZEXT416((uint)(local_1e0 * fVar107)),
                                          ZEXT416((uint)(local_1e0 * local_1e0)),ZEXT416(0x40000000)
                                         );
                fVar124 = auVar16._0_4_ * 3.0;
                fVar106 = local_1e0 * local_1e0 * 3.0;
                auVar156._0_4_ = fVar106 * (float)local_620._0_4_;
                auVar156._4_4_ = fVar106 * (float)local_620._4_4_;
                auVar156._8_4_ = fVar106 * fStack_618;
                auVar156._12_4_ = fVar106 * fStack_614;
                auVar127._4_4_ = fVar124;
                auVar127._0_4_ = fVar124;
                auVar127._8_4_ = fVar124;
                auVar127._12_4_ = fVar124;
                auVar16 = vfmadd132ps_fma(auVar127,auVar156,auVar15);
                fVar124 = auVar17._0_4_ * 3.0;
                auVar149._4_4_ = fVar124;
                auVar149._0_4_ = fVar124;
                auVar149._8_4_ = fVar124;
                auVar149._12_4_ = fVar124;
                auVar16 = vfmadd132ps_fma(auVar149,auVar16,auVar14);
                fVar124 = fVar107 * fVar107 * -3.0;
                local_710.context = context->user;
                auVar128._4_4_ = fVar124;
                auVar128._0_4_ = fVar124;
                auVar128._8_4_ = fVar124;
                auVar128._12_4_ = fVar124;
                auVar17 = vfmadd132ps_fma(auVar128,auVar16,auVar12);
                local_240 = auVar17._0_4_;
                uStack_23c = local_240;
                uStack_238 = local_240;
                uStack_234 = local_240;
                uStack_230 = local_240;
                uStack_22c = local_240;
                uStack_228 = local_240;
                uStack_224 = local_240;
                auVar16 = vmovshdup_avx(auVar17);
                local_220 = auVar16._0_8_;
                uStack_218 = local_220;
                uStack_210 = local_220;
                uStack_208 = local_220;
                auVar16 = vshufps_avx(auVar17,auVar17,0xaa);
                local_200._8_8_ = auVar16._0_8_;
                local_200._0_8_ = local_200._8_8_;
                local_200._16_8_ = local_200._8_8_;
                local_200._24_8_ = local_200._8_8_;
                fStack_1dc = local_1e0;
                fStack_1d8 = local_1e0;
                fStack_1d4 = local_1e0;
                fStack_1d0 = local_1e0;
                fStack_1cc = local_1e0;
                fStack_1c8 = local_1e0;
                fStack_1c4 = local_1e0;
                uStack_1bc = local_1c0;
                uStack_1b8 = local_1c0;
                uStack_1b4 = local_1c0;
                uStack_1b0 = local_1c0;
                uStack_1ac = local_1c0;
                uStack_1a8 = local_1c0;
                uStack_1a4 = local_1c0;
                local_1a0 = local_660._0_8_;
                uStack_198 = local_660._8_8_;
                uStack_190 = local_660._16_8_;
                uStack_188 = local_660._24_8_;
                uStack_7d0 = auVar78._16_8_;
                uStack_7c8 = auVar96._24_8_;
                local_180 = local_7e0;
                uStack_178 = uStack_7d8;
                uStack_170 = uStack_7d0;
                uStack_168 = uStack_7c8;
                local_160 = (local_710.context)->instID[0];
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_140 = (local_710.context)->instPrimID[0];
                uStack_13c = local_140;
                uStack_138 = local_140;
                uStack_134 = local_140;
                uStack_130 = local_140;
                uStack_12c = local_140;
                uStack_128 = local_140;
                uStack_124 = local_140;
                local_640 = local_400;
                local_710.valid = (int *)local_640;
                local_710.geometryUserPtr = *(void **)(CONCAT44(uStack_5dc,local_5e0) + 0x18);
                local_710.hit = (RTCHitN *)&local_240;
                local_710.N = 8;
                pcVar10 = *(code **)(CONCAT44(uStack_5dc,local_5e0) + 0x48);
                local_710.ray = (RTCRayN *)ray;
                if (pcVar10 != (code *)0x0) {
                  auVar196 = ZEXT1632(auVar139._0_16_);
                  (*pcVar10)(&local_710);
                  auVar185 = ZEXT3264(local_6e0);
                  auVar173 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,
                                                  CONCAT416(fVar202,CONCAT412(fVar202,CONCAT48(
                                                  fVar202,CONCAT44(fVar202,fVar202))))))));
                  auVar196 = vpcmpeqd_avx2(auVar196,auVar196);
                  auVar139 = ZEXT3264(auVar196);
                  auVar198 = ZEXT1664(ZEXT816(0) << 0x40);
                  uVar90 = local_680;
                  uVar206 = uStack_678;
                  uVar207 = uStack_670;
                  uVar208 = uStack_668;
                }
                auVar162 = vpcmpeqd_avx2(auVar198._0_32_,local_640);
                auVar196 = auVar139._0_32_ & ~auVar162;
                if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar196 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar196 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar196 >> 0x7f,0) == '\0') &&
                      (auVar196 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar196 >> 0xbf,0) == '\0') &&
                    (auVar196 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar196[0x1f]) {
                  auVar162 = auVar139._0_32_ ^ auVar162;
                }
                else {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(CONCAT44(uStack_5dc,local_5e0) + 0x3e) & 0x40) != 0)))) {
                    auVar196 = ZEXT1632(auVar139._0_16_);
                    (*p_Var11)(&local_710);
                    auVar185 = ZEXT3264(local_6e0);
                    auVar173 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,
                                                  CONCAT416(fVar202,CONCAT412(fVar202,CONCAT48(
                                                  fVar202,CONCAT44(fVar202,fVar202))))))));
                    auVar196 = vpcmpeqd_avx2(auVar196,auVar196);
                    auVar139 = ZEXT3264(auVar196);
                    auVar198 = ZEXT1664(ZEXT816(0) << 0x40);
                    uVar90 = local_680;
                    uVar206 = uStack_678;
                    uVar207 = uStack_670;
                    uVar208 = uStack_668;
                  }
                  auVar196 = vpcmpeqd_avx2(auVar198._0_32_,local_640);
                  auVar162 = auVar139._0_32_ ^ auVar196;
                  auVar135._8_4_ = 0xff800000;
                  auVar135._0_8_ = 0xff800000ff800000;
                  auVar135._12_4_ = 0xff800000;
                  auVar135._16_4_ = 0xff800000;
                  auVar135._20_4_ = 0xff800000;
                  auVar135._24_4_ = 0xff800000;
                  auVar135._28_4_ = 0xff800000;
                  auVar196 = vblendvps_avx(auVar135,*(undefined1 (*) [32])(local_710.ray + 0x100),
                                           auVar196);
                  *(undefined1 (*) [32])(local_710.ray + 0x100) = auVar196;
                }
                auVar209 = auVar185._0_32_;
                if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar162 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar162 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar162 >> 0x7f,0) != '\0') ||
                      (auVar162 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar162 >> 0xbf,0) != '\0') ||
                    (auVar162 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar162[0x1f] < '\0') {
                  uVar84 = CONCAT71((int7)(uVar84 >> 8),1);
                  uStack_678 = uVar206;
                  uStack_670 = uVar207;
                  uStack_668 = uVar208;
                  goto LAB_01102aaf;
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar80;
                uVar20 = uVar84 & 0x3f;
                uVar84 = 0;
                uVar86 = uVar86 ^ 1L << uVar20;
                for (uVar20 = uVar86; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000)
                {
                  uVar84 = uVar84 + 1;
                }
              }
              uVar84 = 0;
              uStack_678 = uVar206;
              uStack_670 = uVar207;
              uStack_668 = uVar208;
            }
          }
          goto LAB_01102aaf;
        }
      }
      uVar84 = 0;
    }
LAB_01102aaf:
    auVar201 = ZEXT3264(auVar201._0_32_);
    auVar198 = ZEXT3264(local_6a0);
    auVar139 = ZEXT464((uint)fVar125);
    if (8 < iVar79) {
      local_4c0._4_4_ = iVar79;
      local_4c0._0_4_ = iVar79;
      local_4c0._8_4_ = iVar79;
      local_4c0._12_4_ = iVar79;
      local_4c0._16_4_ = iVar79;
      local_4c0._20_4_ = iVar79;
      local_4c0._24_4_ = iVar79;
      local_4c0._28_4_ = iVar79;
      local_500._4_4_ = fVar125;
      local_500._0_4_ = fVar125;
      fStack_4f8 = fVar125;
      fStack_4f4 = fVar125;
      fStack_4f0 = fVar125;
      fStack_4ec = fVar125;
      fStack_4e8 = fVar125;
      fStack_4e4 = fVar125;
      local_5e0 = local_6c0._0_4_;
      uStack_5dc = local_6c0._0_4_;
      uStack_5d8 = local_6c0._0_4_;
      uStack_5d4 = local_6c0._0_4_;
      uStack_5d0 = local_6c0._0_4_;
      uStack_5cc = local_6c0._0_4_;
      uStack_5c8 = local_6c0._0_4_;
      uStack_5c4 = local_6c0._0_4_;
      local_120 = 1.0 / (float)local_560._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      local_560._4_4_ = uVar85;
      local_560._0_4_ = uVar85;
      uStack_558._0_4_ = uVar85;
      uStack_558._4_4_ = uVar85;
      local_100 = local_5a0._0_4_;
      uStack_fc = local_5a0._0_4_;
      uStack_f8 = local_5a0._0_4_;
      uStack_f4 = local_5a0._0_4_;
      uStack_f0 = local_5a0._0_4_;
      uStack_ec = local_5a0._0_4_;
      uStack_e8 = local_5a0._0_4_;
      uStack_e4 = local_5a0._0_4_;
      local_6e0 = auVar209;
      local_680 = uVar90;
      uStack_550 = uVar85;
      uStack_54c = uVar85;
      uStack_548 = uVar85;
      uStack_544 = uVar85;
      for (lVar88 = 8; lVar88 < local_610; lVar88 = lVar88 + 8) {
        auVar197 = auVar198._0_32_;
        auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 * 4 + lVar89);
        auVar196 = *(undefined1 (*) [32])(lVar89 + 0x21fb768 + lVar88 * 4);
        auVar162 = *(undefined1 (*) [32])(lVar89 + 0x21fbbec + lVar88 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar89 + 0x21fc070 + lVar88 * 4);
        fVar111 = *(float *)*pauVar2;
        fVar123 = *(float *)(*pauVar2 + 4);
        fVar177 = *(float *)(*pauVar2 + 8);
        fVar186 = *(float *)(*pauVar2 + 0xc);
        fVar187 = *(float *)(*pauVar2 + 0x10);
        fVar188 = *(float *)(*pauVar2 + 0x14);
        fVar189 = *(float *)(*pauVar2 + 0x18);
        auVar76 = *(undefined1 (*) [28])*pauVar2;
        auVar185._0_4_ = fVar111 * auVar173._0_4_;
        auVar185._4_4_ = fVar123 * auVar173._4_4_;
        auVar185._8_4_ = fVar177 * auVar173._8_4_;
        auVar185._12_4_ = fVar186 * auVar173._12_4_;
        auVar185._16_4_ = fVar187 * auVar173._16_4_;
        auVar185._20_4_ = fVar188 * auVar173._20_4_;
        auVar185._28_36_ = auVar198._28_36_;
        auVar185._24_4_ = fVar189 * auVar173._24_4_;
        auVar198._0_4_ = fVar111 * fVar140;
        auVar198._4_4_ = fVar123 * fVar145;
        auVar198._8_4_ = fVar177 * fVar140;
        auVar198._12_4_ = fVar186 * fVar145;
        auVar198._16_4_ = fVar187 * fVar140;
        auVar198._20_4_ = fVar188 * fVar145;
        auVar198._28_36_ = auVar139._28_36_;
        auVar198._24_4_ = fVar189 * fVar140;
        auVar12 = vfmadd231ps_fma(auVar185._0_32_,auVar162,auVar132);
        auVar16 = vfmadd231ps_fma(auVar198._0_32_,auVar162,auVar181);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar196,auVar193);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar196,local_440);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar96,auVar213);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar96,local_5c0);
        auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 * 4 + lVar89);
        auVar119 = *(undefined1 (*) [32])(lVar89 + 0x21fdb88 + lVar88 * 4);
        auVar7 = *(undefined1 (*) [32])(lVar89 + 0x21fe00c + lVar88 * 4);
        pfVar3 = (float *)(lVar89 + 0x21fe490 + lVar88 * 4);
        fVar190 = *pfVar3;
        fVar191 = pfVar3[1];
        fVar68 = pfVar3[2];
        fVar69 = pfVar3[3];
        fVar70 = pfVar3[4];
        fVar71 = pfVar3[5];
        fVar72 = pfVar3[6];
        auVar38._4_4_ = fVar191 * auVar173._4_4_;
        auVar38._0_4_ = fVar190 * auVar173._0_4_;
        auVar38._8_4_ = fVar68 * auVar173._8_4_;
        auVar38._12_4_ = fVar69 * auVar173._12_4_;
        auVar38._16_4_ = fVar70 * auVar173._16_4_;
        auVar38._20_4_ = fVar71 * auVar173._20_4_;
        uVar80 = local_5c0._28_4_;
        auVar38._24_4_ = fVar72 * auVar173._24_4_;
        auVar38._28_4_ = uVar80;
        auVar139._0_4_ = fVar190 * fVar140;
        auVar139._4_4_ = fVar191 * fVar145;
        auVar139._8_4_ = fVar68 * fVar140;
        auVar139._12_4_ = fVar69 * fVar145;
        auVar139._16_4_ = fVar70 * fVar140;
        auVar139._20_4_ = fVar71 * fVar145;
        auVar139._28_36_ = auVar173._28_36_;
        auVar139._24_4_ = fVar72 * fVar140;
        auVar17 = vfmadd231ps_fma(auVar38,auVar7,auVar132);
        auVar94 = vfmadd231ps_fma(auVar139._0_32_,auVar7,auVar181);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar119,auVar193);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar119,local_440);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar103,auVar213);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar103,local_5c0);
        local_460 = ZEXT1632(auVar17);
        local_6c0 = ZEXT1632(auVar12);
        local_4a0 = vsubps_avx(local_460,local_6c0);
        local_660 = ZEXT1632(auVar94);
        auVar136 = ZEXT1632(auVar16);
        local_5a0 = vsubps_avx(local_660,auVar136);
        auVar104._0_4_ = auVar16._0_4_ * local_4a0._0_4_;
        auVar104._4_4_ = auVar16._4_4_ * local_4a0._4_4_;
        auVar104._8_4_ = auVar16._8_4_ * local_4a0._8_4_;
        auVar104._12_4_ = auVar16._12_4_ * local_4a0._12_4_;
        auVar104._16_4_ = local_4a0._16_4_ * 0.0;
        auVar104._20_4_ = local_4a0._20_4_ * 0.0;
        auVar104._24_4_ = local_4a0._24_4_ * 0.0;
        auVar104._28_4_ = 0;
        fVar125 = local_5a0._0_4_;
        fVar124 = local_5a0._4_4_;
        auVar77._4_4_ = auVar12._4_4_ * fVar124;
        auVar77._0_4_ = auVar12._0_4_ * fVar125;
        fVar106 = local_5a0._8_4_;
        auVar77._8_4_ = auVar12._8_4_ * fVar106;
        fVar107 = local_5a0._12_4_;
        auVar77._12_4_ = auVar12._12_4_ * fVar107;
        fVar108 = local_5a0._16_4_;
        auVar77._16_4_ = fVar108 * 0.0;
        fVar109 = local_5a0._20_4_;
        auVar77._20_4_ = fVar109 * 0.0;
        fVar110 = local_5a0._24_4_;
        auVar77._24_4_ = fVar110 * 0.0;
        auVar77._28_4_ = uVar199;
        auVar97 = vsubps_avx(auVar104,auVar77);
        auVar39._4_4_ = fVar123 * local_e0._4_4_;
        auVar39._0_4_ = fVar111 * (float)local_e0;
        auVar39._8_4_ = fVar177 * (float)uStack_d8;
        auVar39._12_4_ = fVar186 * uStack_d8._4_4_;
        auVar39._16_4_ = fVar187 * (float)uStack_d0;
        auVar39._20_4_ = fVar188 * uStack_d0._4_4_;
        auVar39._24_4_ = fVar189 * (float)uStack_c8;
        auVar39._28_4_ = uVar80;
        auVar139 = ZEXT3264(local_c0);
        auVar16 = vfmadd231ps_fma(auVar39,local_c0,auVar162);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_a0,auVar196);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_80,auVar96);
        auVar40._4_4_ = fVar191 * local_e0._4_4_;
        auVar40._0_4_ = fVar190 * (float)local_e0;
        auVar40._8_4_ = fVar68 * (float)uStack_d8;
        auVar40._12_4_ = fVar69 * uStack_d8._4_4_;
        auVar40._16_4_ = fVar70 * (float)uStack_d0;
        auVar40._20_4_ = fVar71 * uStack_d0._4_4_;
        auVar40._24_4_ = fVar72 * (float)uStack_c8;
        auVar40._28_4_ = uStack_c8._4_4_;
        auVar17 = vfmadd231ps_fma(auVar40,auVar7,local_c0);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar119,local_a0);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar103,local_80);
        auVar67._4_4_ = fVar124 * fVar124;
        auVar67._0_4_ = fVar125 * fVar125;
        auVar67._8_4_ = fVar106 * fVar106;
        auVar67._12_4_ = fVar107 * fVar107;
        auVar67._16_4_ = fVar108 * fVar108;
        auVar67._20_4_ = fVar109 * fVar109;
        auVar67._24_4_ = fVar110 * fVar110;
        auVar67._28_4_ = local_440._28_4_;
        auVar94 = vfmadd231ps_fma(auVar67,local_4a0,local_4a0);
        auVar210 = ZEXT1632(auVar16);
        auVar158 = vmaxps_avx(auVar210,ZEXT1632(auVar17));
        auVar182._0_4_ = auVar158._0_4_ * auVar158._0_4_ * auVar94._0_4_;
        auVar182._4_4_ = auVar158._4_4_ * auVar158._4_4_ * auVar94._4_4_;
        auVar182._8_4_ = auVar158._8_4_ * auVar158._8_4_ * auVar94._8_4_;
        auVar182._12_4_ = auVar158._12_4_ * auVar158._12_4_ * auVar94._12_4_;
        auVar182._16_4_ = auVar158._16_4_ * auVar158._16_4_ * 0.0;
        auVar182._20_4_ = auVar158._20_4_ * auVar158._20_4_ * 0.0;
        auVar182._24_4_ = auVar158._24_4_ * auVar158._24_4_ * 0.0;
        auVar182._28_4_ = 0;
        auVar41._4_4_ = auVar97._4_4_ * auVar97._4_4_;
        auVar41._0_4_ = auVar97._0_4_ * auVar97._0_4_;
        auVar41._8_4_ = auVar97._8_4_ * auVar97._8_4_;
        auVar41._12_4_ = auVar97._12_4_ * auVar97._12_4_;
        auVar41._16_4_ = auVar97._16_4_ * auVar97._16_4_;
        auVar41._20_4_ = auVar97._20_4_ * auVar97._20_4_;
        auVar41._24_4_ = auVar97._24_4_ * auVar97._24_4_;
        auVar41._28_4_ = auVar97._28_4_;
        auVar158 = vcmpps_avx(auVar41,auVar182,2);
        local_320 = (int)lVar88;
        auVar183._4_4_ = local_320;
        auVar183._0_4_ = local_320;
        auVar183._8_4_ = local_320;
        auVar183._12_4_ = local_320;
        auVar183._16_4_ = local_320;
        auVar183._20_4_ = local_320;
        auVar183._24_4_ = local_320;
        auVar183._28_4_ = local_320;
        auVar97 = vpor_avx2(auVar183,_DAT_01fb4ba0);
        auVar105 = vpcmpgtd_avx2(local_4c0,auVar97);
        auVar97 = auVar105 & auVar158;
        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar97 >> 0x7f,0) == '\0') &&
              (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar97 >> 0xbf,0) == '\0') &&
            (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar97[0x1f]) {
          auVar198 = ZEXT3264(auVar197);
          auVar173 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,CONCAT416(
                                                  fVar202,CONCAT412(fVar202,CONCAT48(fVar202,
                                                  CONCAT44(fVar202,fVar202))))))));
        }
        else {
          local_4e0 = vandps_avx(auVar105,auVar158);
          auVar42._4_4_ = local_680._4_4_ * fVar191;
          auVar42._0_4_ = (float)local_680 * fVar190;
          auVar42._8_4_ = (float)uStack_678 * fVar68;
          auVar42._12_4_ = uStack_678._4_4_ * fVar69;
          auVar42._16_4_ = (float)uStack_670 * fVar70;
          auVar42._20_4_ = uStack_670._4_4_ * fVar71;
          auVar42._24_4_ = (float)uStack_668 * fVar72;
          auVar42._28_4_ = auVar158._28_4_;
          auVar16 = vfmadd213ps_fma(auVar7,local_580,auVar42);
          auVar16 = vfmadd213ps_fma(auVar119,local_3a0,ZEXT1632(auVar16));
          auVar16 = vfmadd213ps_fma(auVar103,local_6e0,ZEXT1632(auVar16));
          local_480._0_4_ = auVar76._0_4_;
          local_480._4_4_ = auVar76._4_4_;
          fStack_478 = auVar76._8_4_;
          fStack_474 = auVar76._12_4_;
          fStack_470 = auVar76._16_4_;
          fStack_46c = auVar76._20_4_;
          fStack_468 = auVar76._24_4_;
          auVar43._4_4_ = local_680._4_4_ * (float)local_480._4_4_;
          auVar43._0_4_ = (float)local_680 * (float)local_480._0_4_;
          auVar43._8_4_ = (float)uStack_678 * fStack_478;
          auVar43._12_4_ = uStack_678._4_4_ * fStack_474;
          auVar43._16_4_ = (float)uStack_670 * fStack_470;
          auVar43._20_4_ = uStack_670._4_4_ * fStack_46c;
          auVar43._24_4_ = (float)uStack_668 * fStack_468;
          auVar43._28_4_ = auVar158._28_4_;
          auVar94 = vfmadd213ps_fma(auVar162,local_580,auVar43);
          auVar94 = vfmadd213ps_fma(auVar196,local_3a0,ZEXT1632(auVar94));
          auVar196 = *(undefined1 (*) [32])(lVar89 + 0x21fc4f4 + lVar88 * 4);
          auVar162 = *(undefined1 (*) [32])(lVar89 + 0x21fc978 + lVar88 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar89 + 0x21fcdfc + lVar88 * 4);
          pfVar3 = (float *)(lVar89 + 0x21fd280 + lVar88 * 4);
          fVar125 = *pfVar3;
          fVar124 = pfVar3[1];
          fVar106 = pfVar3[2];
          fVar107 = pfVar3[3];
          fVar108 = pfVar3[4];
          fVar109 = pfVar3[5];
          fVar110 = pfVar3[6];
          auVar175._0_4_ = fVar125 * fVar202;
          auVar175._4_4_ = fVar124 * fVar202;
          auVar175._8_4_ = fVar106 * fVar202;
          auVar175._12_4_ = fVar107 * fVar202;
          auVar175._16_4_ = fVar108 * fVar202;
          auVar175._20_4_ = fVar109 * fVar202;
          auVar175._24_4_ = fVar110 * fVar202;
          auVar175._28_4_ = 0;
          auVar204._0_4_ = fVar125 * fVar140;
          auVar204._4_4_ = fVar124 * fVar145;
          auVar204._8_4_ = fVar106 * fVar140;
          auVar204._12_4_ = fVar107 * fVar145;
          auVar204._16_4_ = fVar108 * fVar140;
          auVar204._20_4_ = fVar109 * fVar145;
          auVar204._24_4_ = fVar110 * fVar140;
          auVar204._28_4_ = 0;
          auVar44._4_4_ = fVar124 * local_680._4_4_;
          auVar44._0_4_ = fVar125 * (float)local_680;
          auVar44._8_4_ = fVar106 * (float)uStack_678;
          auVar44._12_4_ = fVar107 * uStack_678._4_4_;
          auVar44._16_4_ = fVar108 * (float)uStack_670;
          auVar44._20_4_ = fVar109 * uStack_670._4_4_;
          auVar44._24_4_ = fVar110 * (float)uStack_668;
          auVar44._28_4_ = pfVar3[7];
          auVar93 = vfmadd231ps_fma(auVar175,auVar103,auVar132);
          auVar126 = vfmadd231ps_fma(auVar204,auVar103,auVar181);
          auVar113 = vfmadd231ps_fma(auVar44,local_580,auVar103);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar162,auVar193);
          auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar162,local_440);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),local_3a0,auVar162);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar196,auVar213);
          auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar196,local_5c0);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),local_6e0,auVar196);
          pfVar3 = (float *)(lVar89 + 0x21ff6a0 + lVar88 * 4);
          fVar125 = *pfVar3;
          fVar124 = pfVar3[1];
          fVar106 = pfVar3[2];
          fVar107 = pfVar3[3];
          fVar108 = pfVar3[4];
          fVar109 = pfVar3[5];
          fVar110 = pfVar3[6];
          auVar45._4_4_ = fVar202 * fVar124;
          auVar45._0_4_ = fVar202 * fVar125;
          auVar45._8_4_ = fVar202 * fVar106;
          auVar45._12_4_ = fVar202 * fVar107;
          auVar45._16_4_ = fVar202 * fVar108;
          auVar45._20_4_ = fVar202 * fVar109;
          auVar45._24_4_ = fVar202 * fVar110;
          auVar45._28_4_ = uVar80;
          auVar46._4_4_ = fVar145 * fVar124;
          auVar46._0_4_ = fVar140 * fVar125;
          auVar46._8_4_ = fVar140 * fVar106;
          auVar46._12_4_ = fVar145 * fVar107;
          auVar46._16_4_ = fVar140 * fVar108;
          auVar46._20_4_ = fVar145 * fVar109;
          auVar46._24_4_ = fVar140 * fVar110;
          auVar46._28_4_ = local_6e0._28_4_;
          auVar47._4_4_ = fVar124 * local_680._4_4_;
          auVar47._0_4_ = fVar125 * (float)local_680;
          auVar47._8_4_ = fVar106 * (float)uStack_678;
          auVar47._12_4_ = fVar107 * uStack_678._4_4_;
          auVar47._16_4_ = fVar108 * (float)uStack_670;
          auVar47._20_4_ = fVar109 * uStack_670._4_4_;
          auVar47._24_4_ = fVar110 * (float)uStack_668;
          auVar47._28_4_ = pfVar3[7];
          auVar196 = *(undefined1 (*) [32])(lVar89 + 0x21ff21c + lVar88 * 4);
          auVar92 = vfmadd231ps_fma(auVar45,auVar196,auVar132);
          auVar114 = vfmadd231ps_fma(auVar46,auVar196,auVar181);
          auVar141 = vfmadd231ps_fma(auVar47,local_580,auVar196);
          auVar196 = *(undefined1 (*) [32])(lVar89 + 0x21fed98 + lVar88 * 4);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar196,auVar193);
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar196,local_440);
          auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar196,local_3a0);
          auVar196 = *(undefined1 (*) [32])(lVar89 + 0x21fe914 + lVar88 * 4);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar196,auVar213);
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar196,local_5c0);
          auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),local_6e0,auVar196);
          auVar184._8_4_ = 0x7fffffff;
          auVar184._0_8_ = 0x7fffffff7fffffff;
          auVar184._12_4_ = 0x7fffffff;
          auVar184._16_4_ = 0x7fffffff;
          auVar184._20_4_ = 0x7fffffff;
          auVar184._24_4_ = 0x7fffffff;
          auVar184._28_4_ = 0x7fffffff;
          auVar196 = vandps_avx(ZEXT1632(auVar93),auVar184);
          auVar162 = vandps_avx(ZEXT1632(auVar126),auVar184);
          auVar162 = vmaxps_avx(auVar196,auVar162);
          auVar196 = vandps_avx(ZEXT1632(auVar113),auVar184);
          auVar196 = vmaxps_avx(auVar162,auVar196);
          auVar196 = vcmpps_avx(auVar196,_local_500,1);
          auVar103 = vblendvps_avx(ZEXT1632(auVar93),local_4a0,auVar196);
          auVar119 = vblendvps_avx(ZEXT1632(auVar126),local_5a0,auVar196);
          auVar196 = vandps_avx(ZEXT1632(auVar92),auVar184);
          auVar162 = vandps_avx(ZEXT1632(auVar114),auVar184);
          auVar162 = vmaxps_avx(auVar196,auVar162);
          auVar196 = vandps_avx(auVar184,ZEXT1632(auVar141));
          auVar196 = vmaxps_avx(auVar162,auVar196);
          auVar162 = vcmpps_avx(auVar196,_local_500,1);
          auVar196 = vblendvps_avx(ZEXT1632(auVar92),local_4a0,auVar162);
          auVar162 = vblendvps_avx(ZEXT1632(auVar114),local_5a0,auVar162);
          auVar94 = vfmadd213ps_fma(auVar96,local_6e0,ZEXT1632(auVar94));
          auVar93 = vfmadd213ps_fma(auVar103,auVar103,ZEXT832(0) << 0x20);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar119,auVar119);
          auVar96 = vrsqrtps_avx(ZEXT1632(auVar93));
          fVar125 = auVar96._0_4_;
          fVar124 = auVar96._4_4_;
          fVar106 = auVar96._8_4_;
          fVar107 = auVar96._12_4_;
          fVar108 = auVar96._16_4_;
          fVar109 = auVar96._20_4_;
          fVar110 = auVar96._24_4_;
          auVar48._4_4_ = fVar124 * fVar124 * fVar124 * auVar93._4_4_ * -0.5;
          auVar48._0_4_ = fVar125 * fVar125 * fVar125 * auVar93._0_4_ * -0.5;
          auVar48._8_4_ = fVar106 * fVar106 * fVar106 * auVar93._8_4_ * -0.5;
          auVar48._12_4_ = fVar107 * fVar107 * fVar107 * auVar93._12_4_ * -0.5;
          auVar48._16_4_ = fVar108 * fVar108 * fVar108 * -0.0;
          auVar48._20_4_ = fVar109 * fVar109 * fVar109 * -0.0;
          auVar48._24_4_ = fVar110 * fVar110 * fVar110 * -0.0;
          auVar48._28_4_ = 0;
          auVar215._8_4_ = 0x3fc00000;
          auVar215._0_8_ = 0x3fc000003fc00000;
          auVar215._12_4_ = 0x3fc00000;
          auVar215._16_4_ = 0x3fc00000;
          auVar215._20_4_ = 0x3fc00000;
          auVar215._24_4_ = 0x3fc00000;
          auVar215._28_4_ = 0x3fc00000;
          auVar93 = vfmadd231ps_fma(auVar48,auVar215,auVar96);
          fVar125 = auVar93._0_4_;
          fVar124 = auVar93._4_4_;
          auVar49._4_4_ = auVar119._4_4_ * fVar124;
          auVar49._0_4_ = auVar119._0_4_ * fVar125;
          fVar106 = auVar93._8_4_;
          auVar49._8_4_ = auVar119._8_4_ * fVar106;
          fVar107 = auVar93._12_4_;
          auVar49._12_4_ = auVar119._12_4_ * fVar107;
          auVar49._16_4_ = auVar119._16_4_ * 0.0;
          auVar49._20_4_ = auVar119._20_4_ * 0.0;
          auVar49._24_4_ = auVar119._24_4_ * 0.0;
          auVar49._28_4_ = auVar96._28_4_;
          auVar50._4_4_ = fVar124 * -auVar103._4_4_;
          auVar50._0_4_ = fVar125 * -auVar103._0_4_;
          auVar50._8_4_ = fVar106 * -auVar103._8_4_;
          auVar50._12_4_ = fVar107 * -auVar103._12_4_;
          auVar50._16_4_ = -auVar103._16_4_ * 0.0;
          auVar50._20_4_ = -auVar103._20_4_ * 0.0;
          auVar50._24_4_ = -auVar103._24_4_ * 0.0;
          auVar50._28_4_ = auVar119._28_4_;
          auVar93 = vfmadd213ps_fma(auVar196,auVar196,ZEXT832(0) << 0x20);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar162,auVar162);
          auVar96 = vrsqrtps_avx(ZEXT1632(auVar93));
          auVar51._28_4_ = fVar145;
          auVar51._0_28_ =
               ZEXT1628(CONCAT412(fVar107 * 0.0,
                                  CONCAT48(fVar106 * 0.0,CONCAT44(fVar124 * 0.0,fVar125 * 0.0))));
          fVar125 = auVar96._0_4_;
          fVar124 = auVar96._4_4_;
          fVar106 = auVar96._8_4_;
          fVar107 = auVar96._12_4_;
          fVar108 = auVar96._16_4_;
          fVar109 = auVar96._20_4_;
          fVar110 = auVar96._24_4_;
          auVar52._4_4_ = fVar124 * fVar124 * fVar124 * auVar93._4_4_ * -0.5;
          auVar52._0_4_ = fVar125 * fVar125 * fVar125 * auVar93._0_4_ * -0.5;
          auVar52._8_4_ = fVar106 * fVar106 * fVar106 * auVar93._8_4_ * -0.5;
          auVar52._12_4_ = fVar107 * fVar107 * fVar107 * auVar93._12_4_ * -0.5;
          auVar52._16_4_ = fVar108 * fVar108 * fVar108 * -0.0;
          auVar52._20_4_ = fVar109 * fVar109 * fVar109 * -0.0;
          auVar52._24_4_ = fVar110 * fVar110 * fVar110 * -0.0;
          auVar52._28_4_ = 0;
          auVar93 = vfmadd231ps_fma(auVar52,auVar215,auVar96);
          fVar125 = auVar93._0_4_;
          fVar124 = auVar93._4_4_;
          auVar53._4_4_ = auVar162._4_4_ * fVar124;
          auVar53._0_4_ = auVar162._0_4_ * fVar125;
          fVar106 = auVar93._8_4_;
          auVar53._8_4_ = auVar162._8_4_ * fVar106;
          fVar107 = auVar93._12_4_;
          auVar53._12_4_ = auVar162._12_4_ * fVar107;
          auVar53._16_4_ = auVar162._16_4_ * 0.0;
          auVar53._20_4_ = auVar162._20_4_ * 0.0;
          auVar53._24_4_ = auVar162._24_4_ * 0.0;
          auVar53._28_4_ = 0;
          auVar54._4_4_ = fVar124 * -auVar196._4_4_;
          auVar54._0_4_ = fVar125 * -auVar196._0_4_;
          auVar54._8_4_ = fVar106 * -auVar196._8_4_;
          auVar54._12_4_ = fVar107 * -auVar196._12_4_;
          auVar54._16_4_ = -auVar196._16_4_ * 0.0;
          auVar54._20_4_ = -auVar196._20_4_ * 0.0;
          auVar54._24_4_ = -auVar196._24_4_ * 0.0;
          auVar54._28_4_ = auVar96._28_4_;
          auVar55._28_4_ = 0xbf000000;
          auVar55._0_28_ =
               ZEXT1628(CONCAT412(fVar107 * 0.0,
                                  CONCAT48(fVar106 * 0.0,CONCAT44(fVar124 * 0.0,fVar125 * 0.0))));
          auVar93 = vfmadd213ps_fma(auVar49,auVar210,local_6c0);
          auVar126 = vfmadd213ps_fma(auVar50,auVar210,auVar136);
          auVar113 = vfmadd213ps_fma(auVar51,auVar210,ZEXT1632(auVar94));
          auVar141 = vfnmadd213ps_fma(auVar49,auVar210,local_6c0);
          auVar92 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar17),local_460);
          auVar147 = vfnmadd213ps_fma(auVar50,auVar210,auVar136);
          auVar121 = ZEXT1632(auVar17);
          auVar17 = vfmadd213ps_fma(auVar54,auVar121,local_660);
          auVar146 = vfnmadd231ps_fma(ZEXT1632(auVar94),auVar210,auVar51);
          auVar94 = vfmadd213ps_fma(auVar55,auVar121,ZEXT1632(auVar16));
          auVar91 = vfnmadd213ps_fma(auVar53,auVar121,local_460);
          auVar112 = vfnmadd213ps_fma(auVar54,auVar121,local_660);
          auVar153 = vfnmadd231ps_fma(ZEXT1632(auVar16),auVar121,auVar55);
          auVar96 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar147));
          auVar196 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar146));
          auVar56._4_4_ = auVar96._4_4_ * auVar146._4_4_;
          auVar56._0_4_ = auVar96._0_4_ * auVar146._0_4_;
          auVar56._8_4_ = auVar96._8_4_ * auVar146._8_4_;
          auVar56._12_4_ = auVar96._12_4_ * auVar146._12_4_;
          auVar56._16_4_ = auVar96._16_4_ * 0.0;
          auVar56._20_4_ = auVar96._20_4_ * 0.0;
          auVar56._24_4_ = auVar96._24_4_ * 0.0;
          auVar56._28_4_ = 0;
          auVar114 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar147),auVar196);
          auVar57._4_4_ = auVar141._4_4_ * auVar196._4_4_;
          auVar57._0_4_ = auVar141._0_4_ * auVar196._0_4_;
          auVar57._8_4_ = auVar141._8_4_ * auVar196._8_4_;
          auVar57._12_4_ = auVar141._12_4_ * auVar196._12_4_;
          auVar57._16_4_ = auVar196._16_4_ * 0.0;
          auVar57._20_4_ = auVar196._20_4_ * 0.0;
          auVar57._24_4_ = auVar196._24_4_ * 0.0;
          auVar57._28_4_ = auVar196._28_4_;
          auVar158 = ZEXT1632(auVar141);
          auVar196 = vsubps_avx(ZEXT1632(auVar92),auVar158);
          auVar105 = ZEXT1632(auVar146);
          auVar16 = vfmsub231ps_fma(auVar57,auVar105,auVar196);
          auVar58._4_4_ = auVar147._4_4_ * auVar196._4_4_;
          auVar58._0_4_ = auVar147._0_4_ * auVar196._0_4_;
          auVar58._8_4_ = auVar147._8_4_ * auVar196._8_4_;
          auVar58._12_4_ = auVar147._12_4_ * auVar196._12_4_;
          auVar58._16_4_ = auVar196._16_4_ * 0.0;
          auVar58._20_4_ = auVar196._20_4_ * 0.0;
          auVar58._24_4_ = auVar196._24_4_ * 0.0;
          auVar58._28_4_ = auVar196._28_4_;
          auVar141 = vfmsub231ps_fma(auVar58,auVar158,auVar96);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar141),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar114));
          auVar136 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,2);
          auVar96 = vblendvps_avx(ZEXT1632(auVar91),ZEXT1632(auVar93),auVar136);
          auVar196 = vblendvps_avx(ZEXT1632(auVar112),ZEXT1632(auVar126),auVar136);
          auVar162 = vblendvps_avx(ZEXT1632(auVar153),ZEXT1632(auVar113),auVar136);
          auVar103 = vblendvps_avx(auVar158,ZEXT1632(auVar92),auVar136);
          auVar119 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar17),auVar136);
          auVar7 = vblendvps_avx(auVar105,ZEXT1632(auVar94),auVar136);
          auVar158 = vblendvps_avx(ZEXT1632(auVar92),auVar158,auVar136);
          auVar97 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar147),auVar136);
          auVar16 = vpackssdw_avx(local_4e0._0_16_,local_4e0._16_16_);
          auVar105 = vblendvps_avx(ZEXT1632(auVar94),auVar105,auVar136);
          auVar158 = vsubps_avx(auVar158,auVar96);
          auVar97 = vsubps_avx(auVar97,auVar196);
          auVar19 = vsubps_avx(auVar105,auVar162);
          auVar98 = vsubps_avx(auVar96,auVar103);
          auVar115 = vsubps_avx(auVar196,auVar119);
          auVar209 = vsubps_avx(auVar162,auVar7);
          auVar159._0_4_ = auVar19._0_4_ * auVar96._0_4_;
          auVar159._4_4_ = auVar19._4_4_ * auVar96._4_4_;
          auVar159._8_4_ = auVar19._8_4_ * auVar96._8_4_;
          auVar159._12_4_ = auVar19._12_4_ * auVar96._12_4_;
          auVar159._16_4_ = auVar19._16_4_ * auVar96._16_4_;
          auVar159._20_4_ = auVar19._20_4_ * auVar96._20_4_;
          auVar159._24_4_ = auVar19._24_4_ * auVar96._24_4_;
          auVar159._28_4_ = 0;
          auVar17 = vfmsub231ps_fma(auVar159,auVar162,auVar158);
          auVar59._4_4_ = auVar158._4_4_ * auVar196._4_4_;
          auVar59._0_4_ = auVar158._0_4_ * auVar196._0_4_;
          auVar59._8_4_ = auVar158._8_4_ * auVar196._8_4_;
          auVar59._12_4_ = auVar158._12_4_ * auVar196._12_4_;
          auVar59._16_4_ = auVar158._16_4_ * auVar196._16_4_;
          auVar59._20_4_ = auVar158._20_4_ * auVar196._20_4_;
          auVar59._24_4_ = auVar158._24_4_ * auVar196._24_4_;
          auVar59._28_4_ = auVar105._28_4_;
          auVar94 = vfmsub231ps_fma(auVar59,auVar96,auVar97);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT1632(auVar17),_DAT_01f7b000);
          auVar160._0_4_ = auVar97._0_4_ * auVar162._0_4_;
          auVar160._4_4_ = auVar97._4_4_ * auVar162._4_4_;
          auVar160._8_4_ = auVar97._8_4_ * auVar162._8_4_;
          auVar160._12_4_ = auVar97._12_4_ * auVar162._12_4_;
          auVar160._16_4_ = auVar97._16_4_ * auVar162._16_4_;
          auVar160._20_4_ = auVar97._20_4_ * auVar162._20_4_;
          auVar160._24_4_ = auVar97._24_4_ * auVar162._24_4_;
          auVar160._28_4_ = 0;
          auVar94 = vfmsub231ps_fma(auVar160,auVar196,auVar19);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar94));
          auVar139 = ZEXT1664(auVar94);
          auVar161._0_4_ = auVar209._0_4_ * auVar103._0_4_;
          auVar161._4_4_ = auVar209._4_4_ * auVar103._4_4_;
          auVar161._8_4_ = auVar209._8_4_ * auVar103._8_4_;
          auVar161._12_4_ = auVar209._12_4_ * auVar103._12_4_;
          auVar161._16_4_ = auVar209._16_4_ * auVar103._16_4_;
          auVar161._20_4_ = auVar209._20_4_ * auVar103._20_4_;
          auVar161._24_4_ = auVar209._24_4_ * auVar103._24_4_;
          auVar161._28_4_ = 0;
          auVar17 = vfmsub231ps_fma(auVar161,auVar98,auVar7);
          auVar60._4_4_ = auVar115._4_4_ * auVar7._4_4_;
          auVar60._0_4_ = auVar115._0_4_ * auVar7._0_4_;
          auVar60._8_4_ = auVar115._8_4_ * auVar7._8_4_;
          auVar60._12_4_ = auVar115._12_4_ * auVar7._12_4_;
          auVar60._16_4_ = auVar115._16_4_ * auVar7._16_4_;
          auVar60._20_4_ = auVar115._20_4_ * auVar7._20_4_;
          auVar60._24_4_ = auVar115._24_4_ * auVar7._24_4_;
          auVar60._28_4_ = auVar7._28_4_;
          auVar93 = vfmsub231ps_fma(auVar60,auVar119,auVar209);
          auVar61._4_4_ = auVar98._4_4_ * auVar119._4_4_;
          auVar61._0_4_ = auVar98._0_4_ * auVar119._0_4_;
          auVar61._8_4_ = auVar98._8_4_ * auVar119._8_4_;
          auVar61._12_4_ = auVar98._12_4_ * auVar119._12_4_;
          auVar61._16_4_ = auVar98._16_4_ * auVar119._16_4_;
          auVar61._20_4_ = auVar98._20_4_ * auVar119._20_4_;
          auVar61._24_4_ = auVar98._24_4_ * auVar119._24_4_;
          auVar61._28_4_ = auVar119._28_4_;
          auVar126 = vfmsub231ps_fma(auVar61,auVar115,auVar103);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar126),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar93));
          auVar103 = vmaxps_avx(ZEXT1632(auVar94),ZEXT1632(auVar93));
          auVar103 = vcmpps_avx(auVar103,ZEXT832(0) << 0x20,2);
          auVar17 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
          auVar16 = vpand_avx(auVar17,auVar16);
          auVar103 = vpmovsxwd_avx2(auVar16);
          if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar103 >> 0x7f,0) == '\0') &&
                (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar103 >> 0xbf,0) == '\0') &&
              (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar103[0x1f]) {
            auVar96 = vpcmpeqd_avx2(auVar158,auVar158);
LAB_01103e00:
            auVar144._8_8_ = uStack_5f8;
            auVar144._0_8_ = local_600;
            auVar144._16_8_ = uStack_5f0;
            auVar144._24_8_ = uStack_5e8;
            auVar201 = ZEXT3264(auVar201._0_32_);
            auVar198 = ZEXT3264(auVar197);
            auVar185 = ZEXT3264(auVar96);
          }
          else {
            auVar62._4_4_ = auVar97._4_4_ * auVar209._4_4_;
            auVar62._0_4_ = auVar97._0_4_ * auVar209._0_4_;
            auVar62._8_4_ = auVar97._8_4_ * auVar209._8_4_;
            auVar62._12_4_ = auVar97._12_4_ * auVar209._12_4_;
            auVar62._16_4_ = auVar97._16_4_ * auVar209._16_4_;
            auVar62._20_4_ = auVar97._20_4_ * auVar209._20_4_;
            auVar62._24_4_ = auVar97._24_4_ * auVar209._24_4_;
            auVar62._28_4_ = auVar103._28_4_;
            auVar92 = vfmsub231ps_fma(auVar62,auVar115,auVar19);
            auVar167._0_4_ = auVar19._0_4_ * auVar98._0_4_;
            auVar167._4_4_ = auVar19._4_4_ * auVar98._4_4_;
            auVar167._8_4_ = auVar19._8_4_ * auVar98._8_4_;
            auVar167._12_4_ = auVar19._12_4_ * auVar98._12_4_;
            auVar167._16_4_ = auVar19._16_4_ * auVar98._16_4_;
            auVar167._20_4_ = auVar19._20_4_ * auVar98._20_4_;
            auVar167._24_4_ = auVar19._24_4_ * auVar98._24_4_;
            auVar167._28_4_ = 0;
            auVar113 = vfmsub231ps_fma(auVar167,auVar158,auVar209);
            auVar63._4_4_ = auVar158._4_4_ * auVar115._4_4_;
            auVar63._0_4_ = auVar158._0_4_ * auVar115._0_4_;
            auVar63._8_4_ = auVar158._8_4_ * auVar115._8_4_;
            auVar63._12_4_ = auVar158._12_4_ * auVar115._12_4_;
            auVar63._16_4_ = auVar158._16_4_ * auVar115._16_4_;
            auVar63._20_4_ = auVar158._20_4_ * auVar115._20_4_;
            auVar63._24_4_ = auVar158._24_4_ * auVar115._24_4_;
            auVar63._28_4_ = auVar115._28_4_;
            auVar114 = vfmsub231ps_fma(auVar63,auVar98,auVar97);
            auVar17 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar113),ZEXT1632(auVar114));
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar92),ZEXT832(0) << 0x20);
            auVar103 = vrcpps_avx(ZEXT1632(auVar126));
            auVar205._8_4_ = 0x3f800000;
            auVar205._0_8_ = 0x3f8000003f800000;
            auVar205._12_4_ = 0x3f800000;
            auVar205._16_4_ = 0x3f800000;
            auVar205._20_4_ = 0x3f800000;
            auVar205._24_4_ = 0x3f800000;
            auVar205._28_4_ = 0x3f800000;
            auVar17 = vfnmadd213ps_fma(auVar103,ZEXT1632(auVar126),auVar205);
            auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar103,auVar103);
            auVar142._0_4_ = auVar114._0_4_ * auVar162._0_4_;
            auVar142._4_4_ = auVar114._4_4_ * auVar162._4_4_;
            auVar142._8_4_ = auVar114._8_4_ * auVar162._8_4_;
            auVar142._12_4_ = auVar114._12_4_ * auVar162._12_4_;
            auVar142._16_4_ = auVar162._16_4_ * 0.0;
            auVar142._20_4_ = auVar162._20_4_ * 0.0;
            auVar142._24_4_ = auVar162._24_4_ * 0.0;
            auVar142._28_4_ = 0;
            auVar113 = vfmadd231ps_fma(auVar142,ZEXT1632(auVar113),auVar196);
            auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar96,ZEXT1632(auVar92));
            fVar125 = auVar17._0_4_;
            fVar124 = auVar17._4_4_;
            fVar106 = auVar17._8_4_;
            fVar107 = auVar17._12_4_;
            auVar162 = ZEXT1632(CONCAT412(fVar107 * auVar113._12_4_,
                                          CONCAT48(fVar106 * auVar113._8_4_,
                                                   CONCAT44(fVar124 * auVar113._4_4_,
                                                            fVar125 * auVar113._0_4_))));
            uVar80 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar143._4_4_ = uVar80;
            auVar143._0_4_ = uVar80;
            auVar143._8_4_ = uVar80;
            auVar143._12_4_ = uVar80;
            auVar143._16_4_ = uVar80;
            auVar143._20_4_ = uVar80;
            auVar143._24_4_ = uVar80;
            auVar143._28_4_ = uVar80;
            auVar75._4_4_ = uStack_5dc;
            auVar75._0_4_ = local_5e0;
            auVar75._8_4_ = uStack_5d8;
            auVar75._12_4_ = uStack_5d4;
            auVar75._16_4_ = uStack_5d0;
            auVar75._20_4_ = uStack_5cc;
            auVar75._24_4_ = uStack_5c8;
            auVar75._28_4_ = uStack_5c4;
            auVar96 = vcmpps_avx(auVar75,auVar162,2);
            auVar196 = vcmpps_avx(auVar162,auVar143,2);
            auVar96 = vandps_avx(auVar196,auVar96);
            auVar17 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
            auVar16 = vpand_avx(auVar16,auVar17);
            auVar96 = vpmovsxwd_avx2(auVar16);
            auVar196 = ZEXT1632(auVar126);
            if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar96 >> 0x7f,0) == '\0') &&
                  (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar96 >> 0xbf,0) == '\0') &&
                (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar96[0x1f]) {
              auVar96 = vpcmpeqd_avx2(auVar196,auVar196);
              goto LAB_01103e00;
            }
            auVar96 = vcmpps_avx(auVar196,ZEXT832(0) << 0x20,4);
            auVar126 = auVar96._16_16_;
            auVar17 = vpackssdw_avx(auVar96._0_16_,auVar126);
            auVar16 = vpand_avx(auVar16,auVar17);
            auVar196 = vpmovsxwd_avx2(auVar16);
            auVar144._8_8_ = uStack_5f8;
            auVar144._0_8_ = local_600;
            auVar144._16_8_ = uStack_5f0;
            auVar144._24_8_ = uStack_5e8;
            auVar96 = vpcmpeqd_avx2(ZEXT1632(auVar126),ZEXT1632(auVar126));
            auVar185 = ZEXT3264(auVar96);
            auVar201 = ZEXT3264(auVar201._0_32_);
            auVar198 = ZEXT3264(auVar197);
            if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar196 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar196 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar196 >> 0x7f,0) != '\0') ||
                  (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar196 >> 0xbf,0) != '\0') ||
                (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar196[0x1f] < '\0') {
              auVar103 = ZEXT1632(CONCAT412(fVar107 * auVar94._12_4_,
                                            CONCAT48(fVar106 * auVar94._8_4_,
                                                     CONCAT44(fVar124 * auVar94._4_4_,
                                                              fVar125 * auVar94._0_4_))));
              auVar64._28_4_ = SUB84(uStack_5e8,4);
              auVar64._0_28_ =
                   ZEXT1628(CONCAT412(fVar107 * auVar93._12_4_,
                                      CONCAT48(fVar106 * auVar93._8_4_,
                                               CONCAT44(fVar124 * auVar93._4_4_,
                                                        fVar125 * auVar93._0_4_))));
              auVar176._8_4_ = 0x3f800000;
              auVar176._0_8_ = 0x3f8000003f800000;
              auVar176._12_4_ = 0x3f800000;
              auVar176._16_4_ = 0x3f800000;
              auVar176._20_4_ = 0x3f800000;
              auVar176._24_4_ = 0x3f800000;
              auVar176._28_4_ = 0x3f800000;
              auVar96 = vsubps_avx(auVar176,auVar103);
              auVar96 = vblendvps_avx(auVar96,auVar103,auVar136);
              auVar201 = ZEXT3264(auVar96);
              auVar96 = vsubps_avx(auVar176,auVar64);
              local_540 = vblendvps_avx(auVar96,auVar64,auVar136);
              auVar139 = ZEXT3264(local_540);
              auVar198 = ZEXT3264(auVar162);
              auVar144 = auVar196;
            }
          }
          if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar144 >> 0x7f,0) == '\0') &&
                (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar144 >> 0xbf,0) == '\0') &&
              (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar144[0x1f]) {
            auVar173 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,CONCAT416(
                                                  fVar202,CONCAT412(fVar202,CONCAT48(fVar202,
                                                  CONCAT44(fVar202,fVar202))))))));
          }
          else {
            auVar96 = vsubps_avx(auVar121,auVar210);
            auVar162 = auVar201._0_32_;
            auVar16 = vfmadd213ps_fma(auVar96,auVar162,auVar210);
            fVar125 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar65._4_4_ = (auVar16._4_4_ + auVar16._4_4_) * fVar125;
            auVar65._0_4_ = (auVar16._0_4_ + auVar16._0_4_) * fVar125;
            auVar65._8_4_ = (auVar16._8_4_ + auVar16._8_4_) * fVar125;
            auVar65._12_4_ = (auVar16._12_4_ + auVar16._12_4_) * fVar125;
            auVar65._16_4_ = fVar125 * 0.0;
            auVar65._20_4_ = fVar125 * 0.0;
            auVar65._24_4_ = fVar125 * 0.0;
            auVar65._28_4_ = fVar125;
            local_6a0 = auVar198._0_32_;
            auVar96 = vcmpps_avx(local_6a0,auVar65,6);
            auVar196 = auVar144 & auVar96;
            auVar173 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,CONCAT416(
                                                  fVar202,CONCAT412(fVar202,CONCAT48(fVar202,
                                                  CONCAT44(fVar202,fVar202))))))));
            if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar196 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar196 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar196 >> 0x7f,0) != '\0') ||
                  (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar196 >> 0xbf,0) != '\0') ||
                (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar196[0x1f] < '\0') {
              auVar122._8_4_ = 0xbf800000;
              auVar122._0_8_ = 0xbf800000bf800000;
              auVar122._12_4_ = 0xbf800000;
              auVar122._16_4_ = 0xbf800000;
              auVar122._20_4_ = 0xbf800000;
              auVar122._24_4_ = 0xbf800000;
              auVar122._28_4_ = 0xbf800000;
              auVar137._8_4_ = 0x40000000;
              auVar137._0_8_ = 0x4000000040000000;
              auVar137._12_4_ = 0x40000000;
              auVar137._16_4_ = 0x40000000;
              auVar137._20_4_ = 0x40000000;
              auVar137._24_4_ = 0x40000000;
              auVar137._28_4_ = 0x40000000;
              auVar139 = ZEXT3264(auVar137);
              auVar16 = vfmadd213ps_fma(local_540,auVar137,auVar122);
              local_360 = ZEXT1632(auVar16);
              local_300 = local_730;
              uStack_2f8 = uStack_728;
              local_2f0 = local_740;
              uStack_2e8 = uStack_738;
              pGVar9 = (context->scene->geometries).items[uVar85].ptr;
              local_540 = local_360;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                pRVar83 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar83 = context->args;
                if ((pRVar83->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar83 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar83 >> 8),1),
                   pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_6c0 = ZEXT1632(CONCAT124(auVar12._4_12_,(int)uVar84));
                  auVar96 = vandps_avx(auVar96,auVar144);
                  fVar125 = (float)local_320;
                  auVar139 = ZEXT3264(CONCAT428(fVar125,CONCAT424(fVar125,CONCAT420(fVar125,
                                                  CONCAT416(fVar125,CONCAT412(fVar125,CONCAT48(
                                                  fVar125,CONCAT44(fVar125,fVar125))))))));
                  local_2a0[0] = (fVar125 + auVar201._0_4_ + 0.0) * local_120;
                  local_2a0[1] = (fVar125 + auVar201._4_4_ + 1.0) * fStack_11c;
                  local_2a0[2] = (fVar125 + auVar201._8_4_ + 2.0) * fStack_118;
                  local_2a0[3] = (fVar125 + auVar201._12_4_ + 3.0) * fStack_114;
                  fStack_290 = (fVar125 + auVar201._16_4_ + 4.0) * fStack_110;
                  fStack_28c = (fVar125 + auVar201._20_4_ + 5.0) * fStack_10c;
                  fStack_288 = (fVar125 + auVar201._24_4_ + 6.0) * fStack_108;
                  fStack_284 = fVar125 + auVar201._28_4_ + 7.0;
                  local_540._0_8_ = auVar16._0_8_;
                  local_540._8_8_ = auVar16._8_8_;
                  local_280 = local_540._0_8_;
                  uStack_278 = local_540._8_8_;
                  uStack_270 = 0;
                  uStack_268 = 0;
                  local_260 = local_6a0;
                  uVar80 = vmovmskps_avx(auVar96);
                  uVar84 = 0;
                  uVar86 = CONCAT44((int)((ulong)pRVar83 >> 0x20),uVar80);
                  for (uVar20 = uVar86; _local_480 = *pauVar2, local_380 = auVar162,
                      local_340 = local_6a0, local_31c = iVar79, local_310 = uVar73,
                      uStack_308 = uVar74, (uVar20 & 1) == 0;
                      uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                    uVar84 = uVar84 + 1;
                  }
                  while (auVar96 = auVar185._0_32_, uVar86 != 0) {
                    uVar80 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_1e0 = local_2a0[uVar84];
                    local_1c0 = *(undefined4 *)((long)&local_280 + uVar84 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_260 + uVar84 * 4);
                    fVar106 = 1.0 - local_1e0;
                    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar106 * fVar106)),
                                              ZEXT416((uint)(local_1e0 * fVar106)),
                                              ZEXT416(0xc0000000));
                    auVar12 = vfmsub132ss_fma(ZEXT416((uint)(local_1e0 * fVar106)),
                                              ZEXT416((uint)(local_1e0 * local_1e0)),
                                              ZEXT416(0x40000000));
                    fVar125 = auVar12._0_4_ * 3.0;
                    fVar124 = local_1e0 * local_1e0 * 3.0;
                    auVar157._0_4_ = fVar124 * (float)local_620._0_4_;
                    auVar157._4_4_ = fVar124 * (float)local_620._4_4_;
                    auVar157._8_4_ = fVar124 * fStack_618;
                    auVar157._12_4_ = fVar124 * fStack_614;
                    auVar129._4_4_ = fVar125;
                    auVar129._0_4_ = fVar125;
                    auVar129._8_4_ = fVar125;
                    auVar129._12_4_ = fVar125;
                    auVar12 = vfmadd132ps_fma(auVar129,auVar157,auVar15);
                    fVar125 = auVar16._0_4_ * 3.0;
                    auVar150._4_4_ = fVar125;
                    auVar150._0_4_ = fVar125;
                    auVar150._8_4_ = fVar125;
                    auVar150._12_4_ = fVar125;
                    auVar12 = vfmadd132ps_fma(auVar150,auVar12,auVar14);
                    fVar125 = fVar106 * fVar106 * -3.0;
                    local_710.context = context->user;
                    auVar130._4_4_ = fVar125;
                    auVar130._0_4_ = fVar125;
                    auVar130._8_4_ = fVar125;
                    auVar130._12_4_ = fVar125;
                    auVar16 = vfmadd132ps_fma(auVar130,auVar12,auVar13);
                    local_240 = auVar16._0_4_;
                    uStack_23c = local_240;
                    uStack_238 = local_240;
                    uStack_234 = local_240;
                    uStack_230 = local_240;
                    uStack_22c = local_240;
                    uStack_228 = local_240;
                    uStack_224 = local_240;
                    auVar12 = vmovshdup_avx(auVar16);
                    local_220 = auVar12._0_8_;
                    uStack_218 = local_220;
                    uStack_210 = local_220;
                    uStack_208 = local_220;
                    auVar12 = vshufps_avx(auVar16,auVar16,0xaa);
                    auVar131._0_8_ = auVar12._0_8_;
                    auVar131._8_8_ = auVar131._0_8_;
                    local_200._16_8_ = auVar131._0_8_;
                    local_200._0_16_ = auVar131;
                    local_200._24_8_ = auVar131._0_8_;
                    auVar139 = ZEXT3264(local_200);
                    fStack_1dc = local_1e0;
                    fStack_1d8 = local_1e0;
                    fStack_1d4 = local_1e0;
                    fStack_1d0 = local_1e0;
                    fStack_1cc = local_1e0;
                    fStack_1c8 = local_1e0;
                    fStack_1c4 = local_1e0;
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = CONCAT44(uStack_fc,local_100);
                    uStack_198 = CONCAT44(uStack_f4,uStack_f8);
                    uStack_190 = CONCAT44(uStack_ec,uStack_f0);
                    uStack_188 = CONCAT44(uStack_e4,uStack_e8);
                    local_180 = local_560;
                    uStack_178 = uStack_558;
                    uStack_170 = CONCAT44(uStack_54c,uStack_550);
                    uStack_168 = CONCAT44(uStack_544,uStack_548);
                    local_160 = (local_710.context)->instID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_140 = (local_710.context)->instPrimID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_640 = local_400;
                    local_710.valid = (int *)local_640;
                    local_710.geometryUserPtr = pGVar9->userPtr;
                    local_710.hit = (RTCHitN *)&local_240;
                    local_710.N = 8;
                    local_710.ray = (RTCRayN *)ray;
                    if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar139 = ZEXT1664(auVar131);
                      auVar96 = ZEXT1632(auVar185._0_16_);
                      (*pGVar9->occlusionFilterN)(&local_710);
                    }
                    auVar196 = vpcmpeqd_avx2(local_640,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar103 = vpcmpeqd_avx2(auVar96,auVar96);
                    auVar96 = auVar103 & ~auVar196;
                    if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar96 >> 0x7f,0) == '\0') &&
                          (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar96 >> 0xbf,0) == '\0') &&
                        (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar96[0x1f]) {
                      auVar196 = auVar103 ^ auVar196;
                    }
                    else {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar103 = ZEXT1632(auVar103._0_16_);
                        (*p_Var11)(&local_710);
                      }
                      auVar96 = vpcmpeqd_avx2(local_640,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                      auVar103 = vpcmpeqd_avx2(auVar103,auVar103);
                      auVar196 = auVar103 ^ auVar96;
                      auVar138._8_4_ = 0xff800000;
                      auVar138._0_8_ = 0xff800000ff800000;
                      auVar138._12_4_ = 0xff800000;
                      auVar138._16_4_ = 0xff800000;
                      auVar138._20_4_ = 0xff800000;
                      auVar138._24_4_ = 0xff800000;
                      auVar138._28_4_ = 0xff800000;
                      auVar139 = ZEXT3264(auVar138);
                      auVar96 = vblendvps_avx(auVar138,*(undefined1 (*) [32])(local_710.ray + 0x100)
                                              ,auVar96);
                      *(undefined1 (*) [32])(local_710.ray + 0x100) = auVar96;
                    }
                    auVar185 = ZEXT3264(auVar103);
                    if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar196 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar196 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar196 >> 0x7f,0) != '\0') ||
                          (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar196 >> 0xbf,0) != '\0') ||
                        (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar196[0x1f] < '\0') {
                      pRVar83 = (RTCIntersectArguments *)0x1;
                      goto LAB_01103e1d;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar80;
                    uVar20 = uVar84 & 0x3f;
                    uVar84 = 0;
                    uVar86 = uVar86 ^ 1L << uVar20;
                    for (uVar20 = uVar86; (uVar20 & 1) == 0;
                        uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                      uVar84 = uVar84 + 1;
                    }
                  }
                  pRVar83 = (RTCIntersectArguments *)0x0;
LAB_01103e1d:
                  auVar201 = ZEXT3264(auVar162);
                  auVar198 = ZEXT3264(local_6a0);
                  auVar173 = ZEXT3264(CONCAT428(fVar202,CONCAT424(fVar202,CONCAT420(fVar202,
                                                  CONCAT416(fVar202,CONCAT412(fVar202,CONCAT48(
                                                  fVar202,CONCAT44(fVar202,fVar202))))))));
                  uVar84 = (ulong)(uint)local_6c0._0_4_;
                }
              }
              uVar84 = CONCAT71((int7)(uVar84 >> 8),(byte)uVar84 | (byte)pRVar83);
            }
          }
        }
      }
    }
    if ((uVar84 & 1) != 0) break;
    uVar80 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar95._4_4_ = uVar80;
    auVar95._0_4_ = uVar80;
    auVar95._8_4_ = uVar80;
    auVar95._12_4_ = uVar80;
    auVar12 = vcmpps_avx(local_420,auVar95,2);
    uVar85 = vmovmskps_avx(auVar12);
  }
  return local_608 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }